

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O3

void secp256k1_gej_add_ge_var(secp256k1_gej *r,secp256k1_gej *a,secp256k1_ge *b,secp256k1_fe *rzr)

{
  secp256k1_fe *psVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  undefined1 auVar333 [16];
  undefined1 auVar334 [16];
  undefined1 auVar335 [16];
  undefined1 auVar336 [16];
  undefined1 auVar337 [16];
  undefined1 auVar338 [16];
  undefined1 auVar339 [16];
  undefined1 auVar340 [16];
  undefined1 auVar341 [16];
  undefined1 auVar342 [16];
  undefined1 auVar343 [16];
  undefined1 auVar344 [16];
  undefined1 auVar345 [16];
  undefined1 auVar346 [16];
  undefined1 auVar347 [16];
  undefined1 auVar348 [16];
  undefined1 auVar349 [16];
  undefined1 auVar350 [16];
  undefined1 auVar351 [16];
  undefined1 auVar352 [16];
  undefined1 auVar353 [16];
  undefined1 auVar354 [16];
  undefined1 auVar355 [16];
  undefined1 auVar356 [16];
  undefined1 auVar357 [16];
  undefined1 auVar358 [16];
  undefined1 auVar359 [16];
  undefined1 auVar360 [16];
  undefined1 auVar361 [16];
  undefined1 auVar362 [16];
  undefined1 auVar363 [16];
  undefined1 auVar364 [16];
  undefined1 auVar365 [16];
  undefined1 auVar366 [16];
  undefined1 auVar367 [16];
  undefined1 auVar368 [16];
  undefined1 auVar369 [16];
  undefined1 auVar370 [16];
  undefined1 auVar371 [16];
  undefined1 auVar372 [16];
  undefined1 auVar373 [16];
  undefined1 auVar374 [16];
  undefined1 auVar375 [16];
  undefined1 auVar376 [16];
  undefined1 auVar377 [16];
  undefined1 auVar378 [16];
  undefined1 auVar379 [16];
  undefined1 auVar380 [16];
  undefined1 auVar381 [16];
  undefined1 auVar382 [16];
  undefined1 auVar383 [16];
  undefined1 auVar384 [16];
  undefined1 auVar385 [16];
  undefined1 auVar386 [16];
  undefined1 auVar387 [16];
  undefined1 auVar388 [16];
  undefined1 auVar389 [16];
  undefined1 auVar390 [16];
  undefined1 auVar391 [16];
  undefined1 auVar392 [16];
  undefined1 auVar393 [16];
  undefined1 auVar394 [16];
  undefined1 auVar395 [16];
  undefined1 auVar396 [16];
  undefined1 auVar397 [16];
  undefined1 auVar398 [16];
  undefined1 auVar399 [16];
  undefined1 auVar400 [16];
  undefined1 auVar401 [16];
  undefined1 auVar402 [16];
  undefined1 auVar403 [16];
  undefined1 auVar404 [16];
  undefined1 auVar405 [16];
  undefined1 auVar406 [16];
  undefined1 auVar407 [16];
  undefined1 auVar408 [16];
  undefined1 auVar409 [16];
  undefined1 auVar410 [16];
  undefined1 auVar411 [16];
  undefined1 auVar412 [16];
  undefined1 auVar413 [16];
  undefined1 auVar414 [16];
  undefined1 auVar415 [16];
  undefined1 auVar416 [16];
  undefined1 auVar417 [16];
  undefined1 auVar418 [16];
  undefined1 auVar419 [16];
  undefined1 auVar420 [16];
  undefined1 auVar421 [16];
  undefined1 auVar422 [16];
  undefined1 auVar423 [16];
  undefined1 auVar424 [16];
  undefined1 auVar425 [16];
  undefined1 auVar426 [16];
  undefined1 auVar427 [16];
  undefined1 auVar428 [16];
  undefined1 auVar429 [16];
  undefined1 auVar430 [16];
  undefined1 auVar431 [16];
  undefined1 auVar432 [16];
  undefined1 auVar433 [16];
  undefined1 auVar434 [16];
  undefined1 auVar435 [16];
  undefined1 auVar436 [16];
  undefined1 auVar437 [16];
  undefined1 auVar438 [16];
  undefined1 auVar439 [16];
  undefined1 auVar440 [16];
  undefined1 auVar441 [16];
  undefined1 auVar442 [16];
  undefined1 auVar443 [16];
  undefined1 auVar444 [16];
  undefined1 auVar445 [16];
  undefined1 auVar446 [16];
  undefined1 auVar447 [16];
  undefined1 auVar448 [16];
  undefined1 auVar449 [16];
  undefined1 auVar450 [16];
  undefined1 auVar451 [16];
  undefined1 auVar452 [16];
  undefined1 auVar453 [16];
  undefined1 auVar454 [16];
  undefined1 auVar455 [16];
  undefined1 auVar456 [16];
  undefined1 auVar457 [16];
  undefined1 auVar458 [16];
  undefined1 auVar459 [16];
  undefined1 auVar460 [16];
  undefined1 auVar461 [16];
  undefined1 auVar462 [16];
  undefined1 auVar463 [16];
  undefined1 auVar464 [16];
  undefined1 auVar465 [16];
  undefined1 auVar466 [16];
  undefined1 auVar467 [16];
  undefined1 auVar468 [16];
  undefined1 auVar469 [16];
  undefined1 auVar470 [16];
  undefined1 auVar471 [16];
  undefined1 auVar472 [16];
  undefined1 auVar473 [16];
  undefined1 auVar474 [16];
  undefined1 auVar475 [16];
  undefined1 auVar476 [16];
  undefined1 auVar477 [16];
  undefined1 auVar478 [16];
  undefined1 auVar479 [16];
  undefined1 auVar480 [16];
  undefined1 auVar481 [16];
  undefined1 auVar482 [16];
  undefined1 auVar483 [16];
  undefined1 auVar484 [16];
  undefined1 auVar485 [16];
  undefined1 auVar486 [16];
  undefined1 auVar487 [16];
  undefined1 auVar488 [16];
  undefined1 auVar489 [16];
  undefined1 auVar490 [16];
  undefined1 auVar491 [16];
  undefined1 auVar492 [16];
  undefined1 auVar493 [16];
  undefined1 auVar494 [16];
  undefined1 auVar495 [16];
  undefined1 auVar496 [16];
  undefined1 auVar497 [16];
  undefined1 auVar498 [16];
  undefined1 auVar499 [16];
  undefined1 auVar500 [16];
  undefined1 auVar501 [16];
  undefined1 auVar502 [16];
  undefined1 auVar503 [16];
  undefined1 auVar504 [16];
  undefined1 auVar505 [16];
  undefined1 auVar506 [16];
  undefined1 auVar507 [16];
  undefined1 auVar508 [16];
  undefined1 auVar509 [16];
  undefined1 auVar510 [16];
  undefined1 auVar511 [16];
  undefined1 auVar512 [16];
  undefined1 auVar513 [16];
  undefined1 auVar514 [16];
  undefined1 auVar515 [16];
  undefined1 auVar516 [16];
  undefined1 auVar517 [16];
  undefined1 auVar518 [16];
  undefined1 auVar519 [16];
  undefined1 auVar520 [16];
  undefined1 auVar521 [16];
  undefined1 auVar522 [16];
  undefined1 auVar523 [16];
  undefined1 auVar524 [16];
  undefined1 auVar525 [16];
  undefined1 auVar526 [16];
  undefined1 auVar527 [16];
  undefined1 auVar528 [16];
  undefined1 auVar529 [16];
  undefined1 auVar530 [16];
  undefined1 auVar531 [16];
  undefined1 auVar532 [16];
  undefined1 auVar533 [16];
  undefined1 auVar534 [16];
  undefined1 auVar535 [16];
  undefined1 auVar536 [16];
  undefined1 auVar537 [16];
  undefined1 auVar538 [16];
  undefined1 auVar539 [16];
  undefined1 auVar540 [16];
  undefined1 auVar541 [16];
  undefined1 auVar542 [16];
  undefined1 auVar543 [16];
  undefined1 auVar544 [16];
  undefined1 auVar545 [16];
  undefined1 auVar546 [16];
  undefined1 auVar547 [16];
  undefined1 auVar548 [16];
  undefined1 auVar549 [16];
  undefined1 auVar550 [16];
  undefined1 auVar551 [16];
  undefined1 auVar552 [16];
  undefined1 auVar553 [16];
  undefined1 auVar554 [16];
  undefined1 auVar555 [16];
  undefined1 auVar556 [16];
  undefined1 auVar557 [16];
  undefined1 auVar558 [16];
  undefined1 auVar559 [16];
  undefined1 auVar560 [16];
  undefined1 auVar561 [16];
  undefined1 auVar562 [16];
  undefined1 auVar563 [16];
  undefined1 auVar564 [16];
  undefined1 auVar565 [16];
  undefined1 auVar566 [16];
  undefined1 auVar567 [16];
  undefined1 auVar568 [16];
  undefined1 auVar569 [16];
  undefined1 auVar570 [16];
  undefined1 auVar571 [16];
  undefined1 auVar572 [16];
  undefined1 auVar573 [16];
  undefined1 auVar574 [16];
  undefined1 auVar575 [16];
  undefined1 auVar576 [16];
  undefined1 auVar577 [16];
  undefined1 auVar578 [16];
  undefined1 auVar579 [16];
  undefined1 auVar580 [16];
  undefined1 auVar581 [16];
  undefined1 auVar582 [16];
  undefined1 auVar583 [16];
  undefined1 auVar584 [16];
  undefined1 auVar585 [16];
  undefined1 auVar586 [16];
  undefined1 auVar587 [16];
  undefined1 auVar588 [16];
  undefined1 auVar589 [16];
  undefined1 auVar590 [16];
  undefined1 auVar591 [16];
  undefined1 auVar592 [16];
  undefined1 auVar593 [16];
  undefined1 auVar594 [16];
  undefined1 auVar595 [16];
  undefined1 auVar596 [16];
  undefined1 auVar597 [16];
  undefined1 auVar598 [16];
  undefined1 auVar599 [16];
  undefined1 auVar600 [16];
  undefined1 auVar601 [16];
  undefined1 auVar602 [16];
  undefined1 auVar603 [16];
  undefined1 auVar604 [16];
  undefined1 auVar605 [16];
  undefined1 auVar606 [16];
  undefined1 auVar607 [16];
  undefined1 auVar608 [16];
  undefined1 auVar609 [16];
  undefined1 auVar610 [16];
  undefined1 auVar611 [16];
  undefined1 auVar612 [16];
  undefined1 auVar613 [16];
  undefined1 auVar614 [16];
  undefined1 auVar615 [16];
  undefined1 auVar616 [16];
  undefined1 auVar617 [16];
  undefined1 auVar618 [16];
  undefined1 auVar619 [16];
  undefined1 auVar620 [16];
  undefined1 auVar621 [16];
  undefined1 auVar622 [16];
  undefined1 auVar623 [16];
  undefined1 auVar624 [16];
  undefined1 auVar625 [16];
  undefined1 auVar626 [16];
  undefined1 auVar627 [16];
  undefined1 auVar628 [16];
  undefined1 auVar629 [16];
  undefined1 auVar630 [16];
  undefined1 auVar631 [16];
  undefined1 auVar632 [16];
  undefined1 auVar633 [16];
  undefined1 auVar634 [16];
  uint64_t uVar635;
  uint64_t uVar636;
  uint64_t uVar637;
  int iVar638;
  ulong uVar639;
  ulong uVar640;
  long lVar641;
  ulong uVar642;
  ulong uVar643;
  ulong uVar644;
  ulong uVar645;
  ulong uVar646;
  ulong uVar647;
  ulong uVar648;
  ulong uVar649;
  ulong uVar650;
  ulong uVar651;
  ulong uVar652;
  ulong uVar653;
  ulong uVar654;
  ulong uVar655;
  ulong uVar656;
  ulong uVar657;
  ulong uVar658;
  ulong uVar659;
  ulong uVar660;
  ulong uVar661;
  ulong uVar662;
  ulong uVar663;
  ulong uVar664;
  ulong uVar665;
  ulong uVar666;
  ulong uVar667;
  ulong uVar668;
  ulong uVar669;
  ulong uVar670;
  ulong uVar671;
  ulong uVar672;
  ulong uVar673;
  uint64_t uVar674;
  long lVar675;
  long lVar676;
  long lVar677;
  long lVar678;
  uint64_t tmp3_4;
  uint64_t tmp3_5;
  secp256k1_fe s1;
  uint64_t tmp3_6;
  secp256k1_fe u1;
  uint64_t tmp2_4;
  uint64_t tmp2_2;
  uint64_t tmp1_2;
  secp256k1_fe i2;
  secp256k1_fe t;
  secp256k1_fe h2;
  secp256k1_fe u2;
  secp256k1_fe z12;
  secp256k1_fe s2;
  secp256k1_fe local_178;
  secp256k1_fe local_150;
  ulong local_128;
  ulong local_a8;
  ulong local_a0;
  ulong local_98;
  ulong local_90;
  long lStack_88;
  ulong local_80;
  ulong local_78;
  ulong local_70;
  ulong local_68;
  ulong local_60;
  ulong local_58;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  long lStack_38;
  
  if (a->infinity == 0) {
    if (b->infinity == 0) {
      r->infinity = 0;
      psVar1 = &a->z;
      uVar658 = psVar1->n[0];
      uVar661 = (a->z).n[1];
      uVar665 = (a->z).n[2];
      uVar646 = (a->z).n[3];
      uVar647 = (a->z).n[4];
      auVar2._8_8_ = 0;
      auVar2._0_8_ = uVar658 * 2;
      auVar302._8_8_ = 0;
      auVar302._0_8_ = uVar646;
      auVar3._8_8_ = 0;
      auVar3._0_8_ = uVar661 * 2;
      auVar303._8_8_ = 0;
      auVar303._0_8_ = uVar665;
      auVar4._8_8_ = 0;
      auVar4._0_8_ = uVar647;
      auVar304._8_8_ = 0;
      auVar304._0_8_ = uVar647;
      uVar639 = SUB168(auVar4 * auVar304,0);
      auVar5._8_8_ = 0;
      auVar5._0_8_ = uVar639 & 0xfffffffffffff;
      auVar2 = auVar3 * auVar303 + auVar2 * auVar302 + auVar5 * ZEXT816(0x1000003d10);
      uVar656 = auVar2._0_8_;
      auVar558._8_8_ = 0;
      auVar558._0_8_ = uVar656 >> 0x34 | auVar2._8_8_ << 0xc;
      uVar647 = uVar647 * 2;
      auVar6._8_8_ = 0;
      auVar6._0_8_ = uVar658;
      auVar305._8_8_ = 0;
      auVar305._0_8_ = uVar647;
      auVar7._8_8_ = 0;
      auVar7._0_8_ = uVar661 * 2;
      auVar306._8_8_ = 0;
      auVar306._0_8_ = uVar646;
      auVar8._8_8_ = 0;
      auVar8._0_8_ = uVar665;
      auVar307._8_8_ = 0;
      auVar307._0_8_ = uVar665;
      auVar9._8_8_ = 0;
      auVar9._0_8_ = uVar639 >> 0x34 | SUB168(auVar4 * auVar304,8) << 0xc;
      auVar2 = auVar6 * auVar305 + auVar558 + auVar7 * auVar306 + auVar8 * auVar307 +
               auVar9 * ZEXT816(0x1000003d10);
      uVar639 = auVar2._0_8_;
      auVar559._8_8_ = 0;
      auVar559._0_8_ = uVar639 >> 0x34 | auVar2._8_8_ << 0xc;
      auVar10._8_8_ = 0;
      auVar10._0_8_ = uVar658;
      auVar308._8_8_ = 0;
      auVar308._0_8_ = uVar658;
      auVar11._8_8_ = 0;
      auVar11._0_8_ = uVar661;
      auVar309._8_8_ = 0;
      auVar309._0_8_ = uVar647;
      auVar12._8_8_ = 0;
      auVar12._0_8_ = uVar665 * 2;
      auVar310._8_8_ = 0;
      auVar310._0_8_ = uVar646;
      auVar2 = auVar11 * auVar309 + auVar559 + auVar12 * auVar310;
      uVar657 = auVar2._0_8_;
      auVar561._8_8_ = 0;
      auVar561._0_8_ = uVar657 >> 0x34 | auVar2._8_8_ << 0xc;
      auVar311._8_8_ = 0;
      auVar311._0_8_ = (uVar657 & 0xfffffffffffff) << 4 | (uVar639 & 0xfffffffffffff) >> 0x30;
      auVar2 = auVar10 * auVar308 + ZEXT816(0x1000003d1) * auVar311;
      uVar657 = auVar2._0_8_;
      local_80 = uVar657 & 0xfffffffffffff;
      auVar560._8_8_ = 0;
      auVar560._0_8_ = uVar657 >> 0x34 | auVar2._8_8_ << 0xc;
      auVar13._8_8_ = 0;
      auVar13._0_8_ = uVar658 * 2;
      auVar312._8_8_ = 0;
      auVar312._0_8_ = uVar661;
      auVar14._8_8_ = 0;
      auVar14._0_8_ = uVar665;
      auVar313._8_8_ = 0;
      auVar313._0_8_ = uVar647;
      auVar15._8_8_ = 0;
      auVar15._0_8_ = uVar646;
      auVar314._8_8_ = 0;
      auVar314._0_8_ = uVar646;
      auVar3 = auVar14 * auVar313 + auVar561 + auVar15 * auVar314;
      uVar657 = auVar3._0_8_;
      auVar16._8_8_ = 0;
      auVar16._0_8_ = uVar657 & 0xfffffffffffff;
      auVar2 = auVar13 * auVar312 + auVar560 + auVar16 * ZEXT816(0x1000003d10);
      uVar660 = auVar2._0_8_;
      auVar563._8_8_ = 0;
      auVar563._0_8_ = uVar657 >> 0x34 | auVar3._8_8_ << 0xc;
      local_78 = uVar660 & 0xfffffffffffff;
      auVar562._8_8_ = 0;
      auVar562._0_8_ = uVar660 >> 0x34 | auVar2._8_8_ << 0xc;
      auVar17._8_8_ = 0;
      auVar17._0_8_ = uVar658 * 2;
      auVar315._8_8_ = 0;
      auVar315._0_8_ = uVar665;
      auVar18._8_8_ = 0;
      auVar18._0_8_ = uVar661;
      auVar316._8_8_ = 0;
      auVar316._0_8_ = uVar661;
      auVar19._8_8_ = 0;
      auVar19._0_8_ = uVar646;
      auVar317._8_8_ = 0;
      auVar317._0_8_ = uVar647;
      auVar563 = auVar19 * auVar317 + auVar563;
      uVar658 = auVar563._0_8_;
      auVar20._8_8_ = 0;
      auVar20._0_8_ = uVar658 & 0xfffffffffffff;
      auVar2 = auVar17 * auVar315 + auVar562 + auVar18 * auVar316 + auVar20 * ZEXT816(0x1000003d10);
      uVar661 = auVar2._0_8_;
      local_70 = uVar661 & 0xfffffffffffff;
      auVar564._8_8_ = 0;
      auVar564._0_8_ = (uVar661 >> 0x34 | auVar2._8_8_ << 0xc) + (uVar656 & 0xfffffffffffff);
      auVar21._8_8_ = 0;
      auVar21._0_8_ = uVar658 >> 0x34 | auVar563._8_8_ << 0xc;
      auVar564 = auVar21 * ZEXT816(0x1000003d10) + auVar564;
      uVar658 = auVar564._0_8_;
      local_68 = uVar658 & 0xfffffffffffff;
      local_60 = (uVar658 >> 0x34 | auVar564._8_8_ << 0xc) + (uVar639 & 0xffffffffffff);
      uVar658 = (a->x).n[4];
      uVar657 = (uVar658 >> 0x30) * 0x1000003d1 + (a->x).n[0];
      uVar652 = (uVar657 >> 0x34) + (a->x).n[1];
      uVar657 = uVar657 & 0xfffffffffffff;
      uVar660 = (uVar652 >> 0x34) + (a->x).n[2];
      uVar653 = (uVar660 >> 0x34) + (a->x).n[3];
      uVar652 = uVar652 & 0xfffffffffffff;
      uVar660 = uVar660 & 0xfffffffffffff;
      uVar642 = (uVar653 >> 0x34) + (uVar658 & 0xffffffffffff);
      uVar653 = uVar653 & 0xfffffffffffff;
      uVar658 = (b->x).n[0];
      uVar661 = (b->x).n[1];
      uVar665 = (b->x).n[2];
      uVar646 = (b->x).n[3];
      uVar647 = (b->x).n[4];
      auVar22._8_8_ = 0;
      auVar22._0_8_ = local_80;
      auVar318._8_8_ = 0;
      auVar318._0_8_ = uVar646;
      auVar23._8_8_ = 0;
      auVar23._0_8_ = local_78;
      auVar319._8_8_ = 0;
      auVar319._0_8_ = uVar665;
      auVar24._8_8_ = 0;
      auVar24._0_8_ = local_70;
      auVar320._8_8_ = 0;
      auVar320._0_8_ = uVar661;
      auVar25._8_8_ = 0;
      auVar25._0_8_ = local_68;
      auVar321._8_8_ = 0;
      auVar321._0_8_ = uVar658;
      auVar26._8_8_ = 0;
      auVar26._0_8_ = local_60;
      auVar322._8_8_ = 0;
      auVar322._0_8_ = uVar647;
      uVar639 = SUB168(auVar26 * auVar322,0);
      auVar27._8_8_ = 0;
      auVar27._0_8_ = uVar639 & 0xfffffffffffff;
      auVar2 = auVar23 * auVar319 + auVar22 * auVar318 + auVar24 * auVar320 + auVar25 * auVar321 +
               auVar27 * ZEXT816(0x1000003d10);
      uVar656 = auVar2._0_8_;
      auVar565._8_8_ = 0;
      auVar565._0_8_ = uVar656 >> 0x34 | auVar2._8_8_ << 0xc;
      auVar28._8_8_ = 0;
      auVar28._0_8_ = local_80;
      auVar323._8_8_ = 0;
      auVar323._0_8_ = uVar647;
      auVar29._8_8_ = 0;
      auVar29._0_8_ = local_78;
      auVar324._8_8_ = 0;
      auVar324._0_8_ = uVar646;
      auVar30._8_8_ = 0;
      auVar30._0_8_ = local_70;
      auVar325._8_8_ = 0;
      auVar325._0_8_ = uVar665;
      auVar31._8_8_ = 0;
      auVar31._0_8_ = local_68;
      auVar326._8_8_ = 0;
      auVar326._0_8_ = uVar661;
      auVar32._8_8_ = 0;
      auVar32._0_8_ = local_60;
      auVar327._8_8_ = 0;
      auVar327._0_8_ = uVar658;
      auVar33._8_8_ = 0;
      auVar33._0_8_ = uVar639 >> 0x34 | SUB168(auVar26 * auVar322,8) << 0xc;
      auVar2 = auVar28 * auVar323 + auVar565 + auVar29 * auVar324 + auVar30 * auVar325 +
               auVar31 * auVar326 + auVar32 * auVar327 + auVar33 * ZEXT816(0x1000003d10);
      uVar639 = auVar2._0_8_;
      auVar566._8_8_ = 0;
      auVar566._0_8_ = uVar639 >> 0x34 | auVar2._8_8_ << 0xc;
      auVar34._8_8_ = 0;
      auVar34._0_8_ = local_80;
      auVar328._8_8_ = 0;
      auVar328._0_8_ = uVar658;
      auVar35._8_8_ = 0;
      auVar35._0_8_ = local_78;
      auVar329._8_8_ = 0;
      auVar329._0_8_ = uVar647;
      auVar36._8_8_ = 0;
      auVar36._0_8_ = local_70;
      auVar330._8_8_ = 0;
      auVar330._0_8_ = uVar646;
      auVar37._8_8_ = 0;
      auVar37._0_8_ = local_68;
      auVar331._8_8_ = 0;
      auVar331._0_8_ = uVar665;
      auVar38._8_8_ = 0;
      auVar38._0_8_ = local_60;
      auVar332._8_8_ = 0;
      auVar332._0_8_ = uVar661;
      auVar2 = auVar35 * auVar329 + auVar566 + auVar36 * auVar330 + auVar37 * auVar331 +
               auVar38 * auVar332;
      uVar643 = auVar2._0_8_;
      auVar568._8_8_ = 0;
      auVar568._0_8_ = uVar643 >> 0x34 | auVar2._8_8_ << 0xc;
      auVar333._8_8_ = 0;
      auVar333._0_8_ = (uVar643 & 0xfffffffffffff) << 4 | (uVar639 & 0xfffffffffffff) >> 0x30;
      auVar2 = auVar34 * auVar328 + ZEXT816(0x1000003d1) * auVar333;
      uVar643 = auVar2._0_8_;
      local_a8 = uVar643 & 0xfffffffffffff;
      auVar567._8_8_ = 0;
      auVar567._0_8_ = uVar643 >> 0x34 | auVar2._8_8_ << 0xc;
      auVar39._8_8_ = 0;
      auVar39._0_8_ = local_80;
      auVar334._8_8_ = 0;
      auVar334._0_8_ = uVar661;
      auVar40._8_8_ = 0;
      auVar40._0_8_ = local_78;
      auVar335._8_8_ = 0;
      auVar335._0_8_ = uVar658;
      auVar41._8_8_ = 0;
      auVar41._0_8_ = local_70;
      auVar336._8_8_ = 0;
      auVar336._0_8_ = uVar647;
      auVar42._8_8_ = 0;
      auVar42._0_8_ = local_68;
      auVar337._8_8_ = 0;
      auVar337._0_8_ = uVar646;
      auVar43._8_8_ = 0;
      auVar43._0_8_ = local_60;
      auVar338._8_8_ = 0;
      auVar338._0_8_ = uVar665;
      auVar3 = auVar41 * auVar336 + auVar568 + auVar42 * auVar337 + auVar43 * auVar338;
      uVar643 = auVar3._0_8_;
      auVar44._8_8_ = 0;
      auVar44._0_8_ = uVar643 & 0xfffffffffffff;
      auVar2 = auVar39 * auVar334 + auVar567 + auVar40 * auVar335 + auVar44 * ZEXT816(0x1000003d10);
      uVar662 = auVar2._0_8_;
      auVar570._8_8_ = 0;
      auVar570._0_8_ = uVar643 >> 0x34 | auVar3._8_8_ << 0xc;
      local_a0 = uVar662 & 0xfffffffffffff;
      auVar569._8_8_ = 0;
      auVar569._0_8_ = uVar662 >> 0x34 | auVar2._8_8_ << 0xc;
      auVar45._8_8_ = 0;
      auVar45._0_8_ = local_80;
      auVar339._8_8_ = 0;
      auVar339._0_8_ = uVar665;
      auVar46._8_8_ = 0;
      auVar46._0_8_ = local_78;
      auVar340._8_8_ = 0;
      auVar340._0_8_ = uVar661;
      auVar47._8_8_ = 0;
      auVar47._0_8_ = local_70;
      auVar341._8_8_ = 0;
      auVar341._0_8_ = uVar658;
      auVar48._8_8_ = 0;
      auVar48._0_8_ = local_68;
      auVar342._8_8_ = 0;
      auVar342._0_8_ = uVar647;
      auVar49._8_8_ = 0;
      auVar49._0_8_ = local_60;
      auVar343._8_8_ = 0;
      auVar343._0_8_ = uVar646;
      auVar3 = auVar48 * auVar342 + auVar570 + auVar49 * auVar343;
      uVar658 = auVar3._0_8_;
      auVar50._8_8_ = 0;
      auVar50._0_8_ = uVar658 & 0xfffffffffffff;
      auVar2 = auVar45 * auVar339 + auVar569 + auVar46 * auVar340 + auVar47 * auVar341 +
               auVar50 * ZEXT816(0x1000003d10);
      uVar661 = auVar2._0_8_;
      local_98 = uVar661 & 0xfffffffffffff;
      auVar571._8_8_ = 0;
      auVar571._0_8_ = (uVar661 >> 0x34 | auVar2._8_8_ << 0xc) + (uVar656 & 0xfffffffffffff);
      auVar51._8_8_ = 0;
      auVar51._0_8_ = uVar658 >> 0x34 | auVar3._8_8_ << 0xc;
      auVar571 = auVar51 * ZEXT816(0x1000003d10) + auVar571;
      uVar658 = auVar571._0_8_;
      local_90 = uVar658 & 0xfffffffffffff;
      lStack_88 = (uVar658 >> 0x34 | auVar571._8_8_ << 0xc) + (uVar639 & 0xffffffffffff);
      uVar658 = (a->y).n[4];
      uVar643 = (uVar658 >> 0x30) * 0x1000003d1 + (a->y).n[0];
      uVar654 = (uVar643 >> 0x34) + (a->y).n[1];
      uVar662 = (uVar654 >> 0x34) + (a->y).n[2];
      uVar655 = (uVar662 >> 0x34) + (a->y).n[3];
      uVar663 = (uVar655 >> 0x34) + (uVar658 & 0xffffffffffff);
      uVar643 = uVar643 & 0xfffffffffffff;
      uVar654 = uVar654 & 0xfffffffffffff;
      uVar662 = uVar662 & 0xfffffffffffff;
      uVar655 = uVar655 & 0xfffffffffffff;
      uVar658 = (b->y).n[0];
      uVar661 = (b->y).n[1];
      uVar665 = (b->y).n[2];
      uVar646 = (b->y).n[3];
      uVar647 = (b->y).n[4];
      auVar52._8_8_ = 0;
      auVar52._0_8_ = local_80;
      auVar344._8_8_ = 0;
      auVar344._0_8_ = uVar646;
      auVar53._8_8_ = 0;
      auVar53._0_8_ = local_78;
      auVar345._8_8_ = 0;
      auVar345._0_8_ = uVar665;
      auVar54._8_8_ = 0;
      auVar54._0_8_ = local_70;
      auVar346._8_8_ = 0;
      auVar346._0_8_ = uVar661;
      auVar55._8_8_ = 0;
      auVar55._0_8_ = local_68;
      auVar347._8_8_ = 0;
      auVar347._0_8_ = uVar658;
      auVar56._8_8_ = 0;
      auVar56._0_8_ = local_60;
      auVar348._8_8_ = 0;
      auVar348._0_8_ = uVar647;
      uVar639 = SUB168(auVar56 * auVar348,0);
      auVar57._8_8_ = 0;
      auVar57._0_8_ = uVar639 & 0xfffffffffffff;
      auVar2 = auVar53 * auVar345 + auVar52 * auVar344 + auVar54 * auVar346 + auVar55 * auVar347 +
               auVar57 * ZEXT816(0x1000003d10);
      uVar644 = auVar2._0_8_;
      auVar572._8_8_ = 0;
      auVar572._0_8_ = uVar644 >> 0x34 | auVar2._8_8_ << 0xc;
      auVar58._8_8_ = 0;
      auVar58._0_8_ = local_80;
      auVar349._8_8_ = 0;
      auVar349._0_8_ = uVar647;
      auVar59._8_8_ = 0;
      auVar59._0_8_ = local_78;
      auVar350._8_8_ = 0;
      auVar350._0_8_ = uVar646;
      auVar60._8_8_ = 0;
      auVar60._0_8_ = local_70;
      auVar351._8_8_ = 0;
      auVar351._0_8_ = uVar665;
      auVar61._8_8_ = 0;
      auVar61._0_8_ = local_68;
      auVar352._8_8_ = 0;
      auVar352._0_8_ = uVar661;
      auVar62._8_8_ = 0;
      auVar62._0_8_ = local_60;
      auVar353._8_8_ = 0;
      auVar353._0_8_ = uVar658;
      auVar63._8_8_ = 0;
      auVar63._0_8_ = uVar639 >> 0x34 | SUB168(auVar56 * auVar348,8) << 0xc;
      auVar2 = auVar58 * auVar349 + auVar572 + auVar59 * auVar350 + auVar60 * auVar351 +
               auVar61 * auVar352 + auVar62 * auVar353 + auVar63 * ZEXT816(0x1000003d10);
      uVar645 = auVar2._0_8_;
      auVar573._8_8_ = 0;
      auVar573._0_8_ = uVar645 >> 0x34 | auVar2._8_8_ << 0xc;
      auVar64._8_8_ = 0;
      auVar64._0_8_ = local_80;
      auVar354._8_8_ = 0;
      auVar354._0_8_ = uVar658;
      auVar65._8_8_ = 0;
      auVar65._0_8_ = local_78;
      auVar355._8_8_ = 0;
      auVar355._0_8_ = uVar647;
      auVar66._8_8_ = 0;
      auVar66._0_8_ = local_70;
      auVar356._8_8_ = 0;
      auVar356._0_8_ = uVar646;
      auVar67._8_8_ = 0;
      auVar67._0_8_ = local_68;
      auVar357._8_8_ = 0;
      auVar357._0_8_ = uVar665;
      auVar68._8_8_ = 0;
      auVar68._0_8_ = local_60;
      auVar358._8_8_ = 0;
      auVar358._0_8_ = uVar661;
      auVar2 = auVar65 * auVar355 + auVar573 + auVar66 * auVar356 + auVar67 * auVar357 +
               auVar68 * auVar358;
      uVar639 = auVar2._0_8_;
      auVar575._8_8_ = 0;
      auVar575._0_8_ = uVar639 >> 0x34 | auVar2._8_8_ << 0xc;
      auVar359._8_8_ = 0;
      auVar359._0_8_ = (uVar639 & 0xfffffffffffff) << 4 | (uVar645 & 0xfffffffffffff) >> 0x30;
      auVar2 = auVar64 * auVar354 + ZEXT816(0x1000003d1) * auVar359;
      uVar656 = auVar2._0_8_;
      uVar639 = uVar656 & 0xfffffffffffff;
      auVar574._8_8_ = 0;
      auVar574._0_8_ = uVar656 >> 0x34 | auVar2._8_8_ << 0xc;
      auVar69._8_8_ = 0;
      auVar69._0_8_ = local_80;
      auVar360._8_8_ = 0;
      auVar360._0_8_ = uVar661;
      auVar70._8_8_ = 0;
      auVar70._0_8_ = local_78;
      auVar361._8_8_ = 0;
      auVar361._0_8_ = uVar658;
      auVar71._8_8_ = 0;
      auVar71._0_8_ = local_70;
      auVar362._8_8_ = 0;
      auVar362._0_8_ = uVar647;
      auVar72._8_8_ = 0;
      auVar72._0_8_ = local_68;
      auVar363._8_8_ = 0;
      auVar363._0_8_ = uVar646;
      auVar73._8_8_ = 0;
      auVar73._0_8_ = local_60;
      auVar364._8_8_ = 0;
      auVar364._0_8_ = uVar665;
      auVar3 = auVar71 * auVar362 + auVar575 + auVar72 * auVar363 + auVar73 * auVar364;
      uVar656 = auVar3._0_8_;
      auVar74._8_8_ = 0;
      auVar74._0_8_ = uVar656 & 0xfffffffffffff;
      auVar2 = auVar69 * auVar360 + auVar574 + auVar70 * auVar361 + auVar74 * ZEXT816(0x1000003d10);
      uVar664 = auVar2._0_8_;
      auVar577._8_8_ = 0;
      auVar577._0_8_ = uVar656 >> 0x34 | auVar3._8_8_ << 0xc;
      uVar656 = uVar664 & 0xfffffffffffff;
      auVar576._8_8_ = 0;
      auVar576._0_8_ = uVar664 >> 0x34 | auVar2._8_8_ << 0xc;
      auVar75._8_8_ = 0;
      auVar75._0_8_ = local_80;
      auVar365._8_8_ = 0;
      auVar365._0_8_ = uVar665;
      auVar76._8_8_ = 0;
      auVar76._0_8_ = local_78;
      auVar366._8_8_ = 0;
      auVar366._0_8_ = uVar661;
      auVar77._8_8_ = 0;
      auVar77._0_8_ = local_70;
      auVar367._8_8_ = 0;
      auVar367._0_8_ = uVar658;
      auVar78._8_8_ = 0;
      auVar78._0_8_ = local_68;
      auVar368._8_8_ = 0;
      auVar368._0_8_ = uVar647;
      auVar79._8_8_ = 0;
      auVar79._0_8_ = local_60;
      auVar369._8_8_ = 0;
      auVar369._0_8_ = uVar646;
      auVar3 = auVar78 * auVar368 + auVar577 + auVar79 * auVar369;
      uVar661 = auVar3._0_8_;
      auVar80._8_8_ = 0;
      auVar80._0_8_ = uVar661 & 0xfffffffffffff;
      auVar2 = auVar75 * auVar365 + auVar576 + auVar76 * auVar366 + auVar77 * auVar367 +
               auVar80 * ZEXT816(0x1000003d10);
      uVar665 = auVar2._0_8_;
      uVar658 = uVar665 & 0xfffffffffffff;
      auVar578._8_8_ = 0;
      auVar578._0_8_ = (uVar665 >> 0x34 | auVar2._8_8_ << 0xc) + (uVar644 & 0xfffffffffffff);
      auVar81._8_8_ = 0;
      auVar81._0_8_ = uVar661 >> 0x34 | auVar3._8_8_ << 0xc;
      auVar578 = auVar81 * ZEXT816(0x1000003d10) + auVar578;
      uVar665 = auVar578._0_8_;
      uVar661 = uVar665 & 0xfffffffffffff;
      uVar644 = (uVar665 >> 0x34 | auVar578._8_8_ << 0xc) + (uVar645 & 0xffffffffffff);
      auVar82._8_8_ = 0;
      auVar82._0_8_ = psVar1->n[0];
      auVar370._8_8_ = 0;
      auVar370._0_8_ = uVar661;
      auVar83._8_8_ = 0;
      auVar83._0_8_ = (a->z).n[1];
      auVar371._8_8_ = 0;
      auVar371._0_8_ = uVar658;
      auVar84._8_8_ = 0;
      auVar84._0_8_ = (a->z).n[2];
      auVar372._8_8_ = 0;
      auVar372._0_8_ = uVar656;
      auVar85._8_8_ = 0;
      auVar85._0_8_ = (a->z).n[3];
      auVar373._8_8_ = 0;
      auVar373._0_8_ = uVar639;
      auVar86._8_8_ = 0;
      auVar86._0_8_ = (a->z).n[4];
      auVar374._8_8_ = 0;
      auVar374._0_8_ = uVar644;
      uVar665 = SUB168(auVar86 * auVar374,0);
      auVar87._8_8_ = 0;
      auVar87._0_8_ = uVar665 & 0xfffffffffffff;
      auVar2 = auVar83 * auVar371 + auVar82 * auVar370 + auVar84 * auVar372 + auVar85 * auVar373 +
               auVar87 * ZEXT816(0x1000003d10);
      uVar646 = auVar2._0_8_;
      auVar579._8_8_ = 0;
      auVar579._0_8_ = uVar646 >> 0x34 | auVar2._8_8_ << 0xc;
      auVar88._8_8_ = 0;
      auVar88._0_8_ = psVar1->n[0];
      auVar375._8_8_ = 0;
      auVar375._0_8_ = uVar644;
      auVar89._8_8_ = 0;
      auVar89._0_8_ = (a->z).n[1];
      auVar376._8_8_ = 0;
      auVar376._0_8_ = uVar661;
      auVar90._8_8_ = 0;
      auVar90._0_8_ = (a->z).n[2];
      auVar377._8_8_ = 0;
      auVar377._0_8_ = uVar658;
      auVar91._8_8_ = 0;
      auVar91._0_8_ = (a->z).n[3];
      auVar378._8_8_ = 0;
      auVar378._0_8_ = uVar656;
      auVar92._8_8_ = 0;
      auVar92._0_8_ = (a->z).n[4];
      auVar379._8_8_ = 0;
      auVar379._0_8_ = uVar639;
      auVar93._8_8_ = 0;
      auVar93._0_8_ = uVar665 >> 0x34 | SUB168(auVar86 * auVar374,8) << 0xc;
      auVar2 = auVar88 * auVar375 + auVar579 + auVar89 * auVar376 + auVar90 * auVar377 +
               auVar91 * auVar378 + auVar92 * auVar379 + auVar93 * ZEXT816(0x1000003d10);
      uVar665 = auVar2._0_8_;
      auVar580._8_8_ = 0;
      auVar580._0_8_ = uVar665 >> 0x34 | auVar2._8_8_ << 0xc;
      local_128 = (uVar665 & 0xfffffffffffff) >> 0x30;
      auVar94._8_8_ = 0;
      auVar94._0_8_ = psVar1->n[0];
      auVar380._8_8_ = 0;
      auVar380._0_8_ = uVar639;
      auVar95._8_8_ = 0;
      auVar95._0_8_ = (a->z).n[1];
      auVar381._8_8_ = 0;
      auVar381._0_8_ = uVar644;
      auVar96._8_8_ = 0;
      auVar96._0_8_ = (a->z).n[2];
      auVar382._8_8_ = 0;
      auVar382._0_8_ = uVar661;
      auVar97._8_8_ = 0;
      auVar97._0_8_ = (a->z).n[3];
      auVar383._8_8_ = 0;
      auVar383._0_8_ = uVar658;
      auVar98._8_8_ = 0;
      auVar98._0_8_ = (a->z).n[4];
      auVar384._8_8_ = 0;
      auVar384._0_8_ = uVar656;
      auVar2 = auVar95 * auVar381 + auVar580 + auVar96 * auVar382 + auVar97 * auVar383 +
               auVar98 * auVar384;
      uVar647 = auVar2._0_8_;
      auVar582._8_8_ = 0;
      auVar582._0_8_ = uVar647 >> 0x34 | auVar2._8_8_ << 0xc;
      auVar385._8_8_ = 0;
      auVar385._0_8_ = (uVar647 & 0xfffffffffffff) << 4 | local_128;
      auVar2 = auVar94 * auVar380 + ZEXT816(0x1000003d1) * auVar385;
      uVar647 = auVar2._0_8_;
      local_58 = uVar647 & 0xfffffffffffff;
      auVar581._8_8_ = 0;
      auVar581._0_8_ = uVar647 >> 0x34 | auVar2._8_8_ << 0xc;
      auVar99._8_8_ = 0;
      auVar99._0_8_ = psVar1->n[0];
      auVar386._8_8_ = 0;
      auVar386._0_8_ = uVar656;
      auVar100._8_8_ = 0;
      auVar100._0_8_ = (a->z).n[1];
      auVar387._8_8_ = 0;
      auVar387._0_8_ = uVar639;
      auVar101._8_8_ = 0;
      auVar101._0_8_ = (a->z).n[2];
      auVar388._8_8_ = 0;
      auVar388._0_8_ = uVar644;
      auVar102._8_8_ = 0;
      auVar102._0_8_ = (a->z).n[3];
      auVar389._8_8_ = 0;
      auVar389._0_8_ = uVar661;
      auVar103._8_8_ = 0;
      auVar103._0_8_ = (a->z).n[4];
      auVar390._8_8_ = 0;
      auVar390._0_8_ = uVar658;
      auVar3 = auVar101 * auVar388 + auVar582 + auVar102 * auVar389 + auVar103 * auVar390;
      uVar647 = auVar3._0_8_;
      auVar104._8_8_ = 0;
      auVar104._0_8_ = uVar647 & 0xfffffffffffff;
      auVar2 = auVar99 * auVar386 + auVar581 + auVar100 * auVar387 +
               auVar104 * ZEXT816(0x1000003d10);
      uVar645 = auVar2._0_8_;
      auVar584._8_8_ = 0;
      auVar584._0_8_ = uVar647 >> 0x34 | auVar3._8_8_ << 0xc;
      local_50 = uVar645 & 0xfffffffffffff;
      auVar583._8_8_ = 0;
      auVar583._0_8_ = uVar645 >> 0x34 | auVar2._8_8_ << 0xc;
      auVar105._8_8_ = 0;
      auVar105._0_8_ = psVar1->n[0];
      auVar391._8_8_ = 0;
      auVar391._0_8_ = uVar658;
      auVar106._8_8_ = 0;
      auVar106._0_8_ = (a->z).n[1];
      auVar392._8_8_ = 0;
      auVar392._0_8_ = uVar656;
      auVar107._8_8_ = 0;
      auVar107._0_8_ = (a->z).n[2];
      auVar393._8_8_ = 0;
      auVar393._0_8_ = uVar639;
      auVar108._8_8_ = 0;
      auVar108._0_8_ = (a->z).n[3];
      auVar394._8_8_ = 0;
      auVar394._0_8_ = uVar644;
      auVar109._8_8_ = 0;
      auVar109._0_8_ = (a->z).n[4];
      auVar395._8_8_ = 0;
      auVar395._0_8_ = uVar661;
      auVar3 = auVar108 * auVar394 + auVar584 + auVar109 * auVar395;
      uVar658 = auVar3._0_8_;
      auVar110._8_8_ = 0;
      auVar110._0_8_ = uVar658 & 0xfffffffffffff;
      auVar2 = auVar105 * auVar391 + auVar583 + auVar106 * auVar392 + auVar107 * auVar393 +
               auVar110 * ZEXT816(0x1000003d10);
      uVar661 = auVar2._0_8_;
      local_48 = uVar661 & 0xfffffffffffff;
      auVar585._8_8_ = 0;
      auVar585._0_8_ = (uVar661 >> 0x34 | auVar2._8_8_ << 0xc) + (uVar646 & 0xfffffffffffff);
      auVar111._8_8_ = 0;
      auVar111._0_8_ = uVar658 >> 0x34 | auVar3._8_8_ << 0xc;
      auVar585 = auVar111 * ZEXT816(0x1000003d10) + auVar585;
      uVar658 = auVar585._0_8_;
      local_40 = uVar658 & 0xfffffffffffff;
      lStack_38 = (uVar658 >> 0x34 | auVar585._8_8_ << 0xc) + (uVar665 & 0xffffffffffff);
      local_150.n[0] = (local_a8 - uVar657) + 0x3ffffbfffff0bc;
      local_150.n[1] = (local_a0 - uVar652) + 0x3ffffffffffffc;
      local_150.n[2] = (local_98 - uVar660) + 0x3ffffffffffffc;
      local_178.n[0] = (local_58 - uVar643) + 0x3ffffbfffff0bc;
      local_178.n[1] = (local_50 - uVar654) + 0x3ffffffffffffc;
      local_178.n[2] = (local_48 - uVar662) + 0x3ffffffffffffc;
      local_150.n[3] = (local_90 - uVar653) + 0x3ffffffffffffc;
      local_150.n[4] = (lStack_88 - uVar642) + 0x3fffffffffffc;
      local_178.n[3] = (local_40 - uVar655) + 0x3ffffffffffffc;
      local_178.n[4] = (lStack_38 - uVar663) + 0x3fffffffffffc;
      iVar638 = secp256k1_fe_normalizes_to_zero_var(&local_150);
      if (iVar638 == 0) {
        auVar112._8_8_ = 0;
        auVar112._0_8_ = local_178.n[0] * 2;
        auVar396._8_8_ = 0;
        auVar396._0_8_ = local_178.n[3];
        auVar113._8_8_ = 0;
        auVar113._0_8_ = local_178.n[1] * 2;
        auVar397._8_8_ = 0;
        auVar397._0_8_ = local_178.n[2];
        auVar114._8_8_ = 0;
        auVar114._0_8_ = local_178.n[4];
        auVar398._8_8_ = 0;
        auVar398._0_8_ = local_178.n[4];
        uVar661 = SUB168(auVar114 * auVar398,0);
        auVar115._8_8_ = 0;
        auVar115._0_8_ = uVar661 & 0xfffffffffffff;
        auVar2 = auVar113 * auVar397 + auVar112 * auVar396 + auVar115 * ZEXT816(0x1000003d10);
        uVar665 = auVar2._0_8_;
        auVar586._8_8_ = 0;
        auVar586._0_8_ = uVar665 >> 0x34 | auVar2._8_8_ << 0xc;
        uVar658 = local_178.n[4] * 2;
        auVar116._8_8_ = 0;
        auVar116._0_8_ = local_178.n[0];
        auVar399._8_8_ = 0;
        auVar399._0_8_ = uVar658;
        auVar117._8_8_ = 0;
        auVar117._0_8_ = local_178.n[1] * 2;
        auVar400._8_8_ = 0;
        auVar400._0_8_ = local_178.n[3];
        auVar118._8_8_ = 0;
        auVar118._0_8_ = local_178.n[2];
        auVar401._8_8_ = 0;
        auVar401._0_8_ = local_178.n[2];
        auVar119._8_8_ = 0;
        auVar119._0_8_ = uVar661 >> 0x34 | SUB168(auVar114 * auVar398,8) << 0xc;
        auVar2 = auVar116 * auVar399 + auVar586 + auVar117 * auVar400 + auVar118 * auVar401 +
                 auVar119 * ZEXT816(0x1000003d10);
        uVar659 = auVar2._0_8_;
        auVar587._8_8_ = 0;
        auVar587._0_8_ = uVar659 >> 0x34 | auVar2._8_8_ << 0xc;
        auVar120._8_8_ = 0;
        auVar120._0_8_ = local_178.n[0];
        auVar402._8_8_ = 0;
        auVar402._0_8_ = local_178.n[0];
        auVar121._8_8_ = 0;
        auVar121._0_8_ = local_178.n[1];
        auVar403._8_8_ = 0;
        auVar403._0_8_ = uVar658;
        auVar122._8_8_ = 0;
        auVar122._0_8_ = local_178.n[2] * 2;
        auVar404._8_8_ = 0;
        auVar404._0_8_ = local_178.n[3];
        auVar2 = auVar121 * auVar403 + auVar587 + auVar122 * auVar404;
        uVar661 = auVar2._0_8_;
        auVar589._8_8_ = 0;
        auVar589._0_8_ = uVar661 >> 0x34 | auVar2._8_8_ << 0xc;
        auVar405._8_8_ = 0;
        auVar405._0_8_ = (uVar661 & 0xfffffffffffff) << 4 | (uVar659 & 0xfffffffffffff) >> 0x30;
        uVar666 = auVar182._0_8_;
        auVar182 = auVar120 * auVar402 + ZEXT816(0x1000003d1) * auVar405;
        auVar588._8_8_ = 0;
        auVar588._0_8_ = uVar666 >> 0x34 | auVar182._8_8_ << 0xc;
        auVar123._8_8_ = 0;
        auVar123._0_8_ = local_178.n[0] * 2;
        auVar406._8_8_ = 0;
        auVar406._0_8_ = local_178.n[1];
        auVar124._8_8_ = 0;
        auVar124._0_8_ = local_178.n[2];
        auVar407._8_8_ = 0;
        auVar407._0_8_ = uVar658;
        auVar125._8_8_ = 0;
        auVar125._0_8_ = local_178.n[3];
        auVar408._8_8_ = 0;
        auVar408._0_8_ = local_178.n[3];
        auVar3 = auVar124 * auVar407 + auVar589 + auVar125 * auVar408;
        uVar661 = auVar3._0_8_;
        auVar126._8_8_ = 0;
        auVar126._0_8_ = uVar661 & 0xfffffffffffff;
        auVar2 = auVar123 * auVar406 + auVar588 + auVar126 * ZEXT816(0x1000003d10);
        uVar667 = auVar2._0_8_;
        auVar591._8_8_ = 0;
        auVar591._0_8_ = uVar661 >> 0x34 | auVar3._8_8_ << 0xc;
        auVar590._8_8_ = 0;
        auVar590._0_8_ = uVar667 >> 0x34 | auVar2._8_8_ << 0xc;
        auVar127._8_8_ = 0;
        auVar127._0_8_ = local_178.n[0] * 2;
        auVar409._8_8_ = 0;
        auVar409._0_8_ = local_178.n[2];
        auVar128._8_8_ = 0;
        auVar128._0_8_ = local_178.n[1];
        auVar410._8_8_ = 0;
        auVar410._0_8_ = local_178.n[1];
        auVar129._8_8_ = 0;
        auVar129._0_8_ = local_178.n[3];
        auVar411._8_8_ = 0;
        auVar411._0_8_ = uVar658;
        auVar591 = auVar129 * auVar411 + auVar591;
        uVar658 = auVar591._0_8_;
        auVar130._8_8_ = 0;
        auVar130._0_8_ = uVar658 & 0xfffffffffffff;
        auVar2 = auVar127 * auVar409 + auVar590 + auVar128 * auVar410 +
                 auVar130 * ZEXT816(0x1000003d10);
        uVar668 = auVar2._0_8_;
        auVar592._8_8_ = 0;
        auVar592._0_8_ = (uVar668 >> 0x34 | auVar2._8_8_ << 0xc) + (uVar665 & 0xfffffffffffff);
        auVar131._8_8_ = 0;
        auVar131._0_8_ = uVar658 >> 0x34 | auVar591._8_8_ << 0xc;
        auVar592 = auVar131 * ZEXT816(0x1000003d10) + auVar592;
        uVar669 = auVar592._0_8_;
        auVar132._8_8_ = 0;
        auVar132._0_8_ = local_150.n[0] * 2;
        auVar412._8_8_ = 0;
        auVar412._0_8_ = local_150.n[3];
        auVar133._8_8_ = 0;
        auVar133._0_8_ = local_150.n[1] * 2;
        auVar413._8_8_ = 0;
        auVar413._0_8_ = local_150.n[2];
        auVar134._8_8_ = 0;
        auVar134._0_8_ = local_150.n[4];
        auVar414._8_8_ = 0;
        auVar414._0_8_ = local_150.n[4];
        uVar661 = SUB168(auVar134 * auVar414,0);
        auVar135._8_8_ = 0;
        auVar135._0_8_ = uVar661 & 0xfffffffffffff;
        auVar2 = auVar133 * auVar413 + auVar132 * auVar412 + auVar135 * ZEXT816(0x1000003d10);
        uVar646 = auVar2._0_8_;
        auVar593._8_8_ = 0;
        auVar593._0_8_ = uVar646 >> 0x34 | auVar2._8_8_ << 0xc;
        uVar658 = local_150.n[4] * 2;
        auVar136._8_8_ = 0;
        auVar136._0_8_ = local_150.n[0];
        auVar415._8_8_ = 0;
        auVar415._0_8_ = uVar658;
        auVar137._8_8_ = 0;
        auVar137._0_8_ = local_150.n[1] * 2;
        auVar416._8_8_ = 0;
        auVar416._0_8_ = local_150.n[3];
        auVar138._8_8_ = 0;
        auVar138._0_8_ = local_150.n[2];
        auVar417._8_8_ = 0;
        auVar417._0_8_ = local_150.n[2];
        auVar139._8_8_ = 0;
        auVar139._0_8_ = uVar661 >> 0x34 | SUB168(auVar134 * auVar414,8) << 0xc;
        auVar2 = auVar136 * auVar415 + auVar593 + auVar137 * auVar416 + auVar138 * auVar417 +
                 auVar139 * ZEXT816(0x1000003d10);
        uVar647 = auVar2._0_8_;
        auVar594._8_8_ = 0;
        auVar594._0_8_ = uVar647 >> 0x34 | auVar2._8_8_ << 0xc;
        auVar140._8_8_ = 0;
        auVar140._0_8_ = local_150.n[0];
        auVar418._8_8_ = 0;
        auVar418._0_8_ = local_150.n[0];
        auVar141._8_8_ = 0;
        auVar141._0_8_ = local_150.n[1];
        auVar419._8_8_ = 0;
        auVar419._0_8_ = uVar658;
        auVar142._8_8_ = 0;
        auVar142._0_8_ = local_150.n[2] * 2;
        auVar420._8_8_ = 0;
        auVar420._0_8_ = local_150.n[3];
        auVar2 = auVar141 * auVar419 + auVar594 + auVar142 * auVar420;
        uVar661 = auVar2._0_8_;
        auVar596._8_8_ = 0;
        auVar596._0_8_ = uVar661 >> 0x34 | auVar2._8_8_ << 0xc;
        auVar421._8_8_ = 0;
        auVar421._0_8_ = (uVar661 & 0xfffffffffffff) << 4 | (uVar647 & 0xfffffffffffff) >> 0x30;
        auVar2 = auVar140 * auVar418 + ZEXT816(0x1000003d1) * auVar421;
        uVar665 = auVar2._0_8_;
        uVar661 = uVar665 & 0xfffffffffffff;
        auVar595._8_8_ = 0;
        auVar595._0_8_ = uVar665 >> 0x34 | auVar2._8_8_ << 0xc;
        auVar143._8_8_ = 0;
        auVar143._0_8_ = local_150.n[0] * 2;
        auVar422._8_8_ = 0;
        auVar422._0_8_ = local_150.n[1];
        auVar144._8_8_ = 0;
        auVar144._0_8_ = local_150.n[2];
        auVar423._8_8_ = 0;
        auVar423._0_8_ = uVar658;
        auVar145._8_8_ = 0;
        auVar145._0_8_ = local_150.n[3];
        auVar424._8_8_ = 0;
        auVar424._0_8_ = local_150.n[3];
        auVar3 = auVar144 * auVar423 + auVar596 + auVar145 * auVar424;
        uVar665 = auVar3._0_8_;
        auVar146._8_8_ = 0;
        auVar146._0_8_ = uVar665 & 0xfffffffffffff;
        auVar2 = auVar143 * auVar422 + auVar595 + auVar146 * ZEXT816(0x1000003d10);
        uVar639 = auVar2._0_8_;
        auVar598._8_8_ = 0;
        auVar598._0_8_ = uVar665 >> 0x34 | auVar3._8_8_ << 0xc;
        uVar665 = uVar639 & 0xfffffffffffff;
        auVar597._8_8_ = 0;
        auVar597._0_8_ = uVar639 >> 0x34 | auVar2._8_8_ << 0xc;
        auVar147._8_8_ = 0;
        auVar147._0_8_ = local_150.n[0] * 2;
        auVar425._8_8_ = 0;
        auVar425._0_8_ = local_150.n[2];
        auVar148._8_8_ = 0;
        auVar148._0_8_ = local_150.n[1];
        auVar426._8_8_ = 0;
        auVar426._0_8_ = local_150.n[1];
        auVar149._8_8_ = 0;
        auVar149._0_8_ = local_150.n[3];
        auVar427._8_8_ = 0;
        auVar427._0_8_ = uVar658;
        auVar598 = auVar149 * auVar427 + auVar598;
        uVar639 = auVar598._0_8_;
        auVar150._8_8_ = 0;
        auVar150._0_8_ = uVar639 & 0xfffffffffffff;
        auVar2 = auVar147 * auVar425 + auVar597 + auVar148 * auVar426 +
                 auVar150 * ZEXT816(0x1000003d10);
        uVar656 = auVar2._0_8_;
        uVar658 = uVar656 & 0xfffffffffffff;
        auVar599._8_8_ = 0;
        auVar599._0_8_ = (uVar656 >> 0x34 | auVar2._8_8_ << 0xc) + (uVar646 & 0xfffffffffffff);
        auVar151._8_8_ = 0;
        auVar151._0_8_ = uVar639 >> 0x34 | auVar598._8_8_ << 0xc;
        auVar599 = auVar151 * ZEXT816(0x1000003d10) + auVar599;
        uVar639 = auVar599._0_8_;
        uVar646 = uVar639 & 0xfffffffffffff;
        uVar670 = (uVar639 >> 0x34 | auVar599._8_8_ << 0xc) + (uVar647 & 0xffffffffffff);
        auVar152._8_8_ = 0;
        auVar152._0_8_ = uVar661;
        auVar428._8_8_ = 0;
        auVar428._0_8_ = local_150.n[3];
        auVar153._8_8_ = 0;
        auVar153._0_8_ = uVar665;
        auVar429._8_8_ = 0;
        auVar429._0_8_ = local_150.n[2];
        auVar154._8_8_ = 0;
        auVar154._0_8_ = uVar658;
        auVar430._8_8_ = 0;
        auVar430._0_8_ = local_150.n[1];
        auVar155._8_8_ = 0;
        auVar155._0_8_ = uVar646;
        auVar431._8_8_ = 0;
        auVar431._0_8_ = local_150.n[0];
        auVar156._8_8_ = 0;
        auVar156._0_8_ = uVar670;
        auVar432._8_8_ = 0;
        auVar432._0_8_ = local_150.n[4];
        uVar647 = SUB168(auVar156 * auVar432,0);
        auVar157._8_8_ = 0;
        auVar157._0_8_ = uVar647 & 0xfffffffffffff;
        auVar2 = auVar153 * auVar429 + auVar152 * auVar428 + auVar154 * auVar430 +
                 auVar155 * auVar431 + auVar157 * ZEXT816(0x1000003d10);
        uVar644 = auVar2._0_8_;
        auVar600._8_8_ = 0;
        auVar600._0_8_ = uVar644 >> 0x34 | auVar2._8_8_ << 0xc;
        auVar158._8_8_ = 0;
        auVar158._0_8_ = uVar661;
        auVar433._8_8_ = 0;
        auVar433._0_8_ = local_150.n[4];
        auVar159._8_8_ = 0;
        auVar159._0_8_ = uVar665;
        auVar434._8_8_ = 0;
        auVar434._0_8_ = local_150.n[3];
        auVar160._8_8_ = 0;
        auVar160._0_8_ = uVar658;
        auVar435._8_8_ = 0;
        auVar435._0_8_ = local_150.n[2];
        auVar161._8_8_ = 0;
        auVar161._0_8_ = uVar646;
        auVar436._8_8_ = 0;
        auVar436._0_8_ = local_150.n[1];
        auVar162._8_8_ = 0;
        auVar162._0_8_ = uVar670;
        auVar437._8_8_ = 0;
        auVar437._0_8_ = local_150.n[0];
        auVar163._8_8_ = 0;
        auVar163._0_8_ = uVar647 >> 0x34 | SUB168(auVar156 * auVar432,8) << 0xc;
        auVar2 = auVar158 * auVar433 + auVar600 + auVar159 * auVar434 + auVar160 * auVar435 +
                 auVar161 * auVar436 + auVar162 * auVar437 + auVar163 * ZEXT816(0x1000003d10);
        uVar645 = auVar2._0_8_;
        auVar601._8_8_ = 0;
        auVar601._0_8_ = uVar645 >> 0x34 | auVar2._8_8_ << 0xc;
        auVar164._8_8_ = 0;
        auVar164._0_8_ = uVar661;
        auVar438._8_8_ = 0;
        auVar438._0_8_ = local_150.n[0];
        auVar165._8_8_ = 0;
        auVar165._0_8_ = uVar665;
        auVar439._8_8_ = 0;
        auVar439._0_8_ = local_150.n[4];
        auVar166._8_8_ = 0;
        auVar166._0_8_ = uVar658;
        auVar440._8_8_ = 0;
        auVar440._0_8_ = local_150.n[3];
        auVar167._8_8_ = 0;
        auVar167._0_8_ = uVar646;
        auVar441._8_8_ = 0;
        auVar441._0_8_ = local_150.n[2];
        auVar168._8_8_ = 0;
        auVar168._0_8_ = uVar670;
        auVar442._8_8_ = 0;
        auVar442._0_8_ = local_150.n[1];
        auVar2 = auVar165 * auVar439 + auVar601 + auVar166 * auVar440 + auVar167 * auVar441 +
                 auVar168 * auVar442;
        uVar647 = auVar2._0_8_;
        auVar603._8_8_ = 0;
        auVar603._0_8_ = uVar647 >> 0x34 | auVar2._8_8_ << 0xc;
        auVar443._8_8_ = 0;
        auVar443._0_8_ = (uVar647 & 0xfffffffffffff) << 4 | (uVar645 & 0xfffffffffffff) >> 0x30;
        auVar2 = auVar164 * auVar438 + ZEXT816(0x1000003d1) * auVar443;
        uVar639 = auVar2._0_8_;
        uVar647 = uVar639 & 0xfffffffffffff;
        auVar602._8_8_ = 0;
        auVar602._0_8_ = uVar639 >> 0x34 | auVar2._8_8_ << 0xc;
        auVar169._8_8_ = 0;
        auVar169._0_8_ = uVar661;
        auVar444._8_8_ = 0;
        auVar444._0_8_ = local_150.n[1];
        auVar170._8_8_ = 0;
        auVar170._0_8_ = uVar665;
        auVar445._8_8_ = 0;
        auVar445._0_8_ = local_150.n[0];
        auVar171._8_8_ = 0;
        auVar171._0_8_ = uVar658;
        auVar446._8_8_ = 0;
        auVar446._0_8_ = local_150.n[4];
        auVar172._8_8_ = 0;
        auVar172._0_8_ = uVar646;
        auVar447._8_8_ = 0;
        auVar447._0_8_ = local_150.n[3];
        auVar173._8_8_ = 0;
        auVar173._0_8_ = uVar670;
        auVar448._8_8_ = 0;
        auVar448._0_8_ = local_150.n[2];
        auVar3 = auVar171 * auVar446 + auVar603 + auVar172 * auVar447 + auVar173 * auVar448;
        uVar639 = auVar3._0_8_;
        auVar174._8_8_ = 0;
        auVar174._0_8_ = uVar639 & 0xfffffffffffff;
        auVar2 = auVar169 * auVar444 + auVar602 + auVar170 * auVar445 +
                 auVar174 * ZEXT816(0x1000003d10);
        uVar656 = auVar2._0_8_;
        auVar605._8_8_ = 0;
        auVar605._0_8_ = uVar639 >> 0x34 | auVar3._8_8_ << 0xc;
        uVar639 = uVar656 & 0xfffffffffffff;
        auVar604._8_8_ = 0;
        auVar604._0_8_ = uVar656 >> 0x34 | auVar2._8_8_ << 0xc;
        auVar175._8_8_ = 0;
        auVar175._0_8_ = uVar661;
        auVar449._8_8_ = 0;
        auVar449._0_8_ = local_150.n[2];
        auVar176._8_8_ = 0;
        auVar176._0_8_ = uVar665;
        auVar450._8_8_ = 0;
        auVar450._0_8_ = local_150.n[1];
        auVar177._8_8_ = 0;
        auVar177._0_8_ = uVar658;
        auVar451._8_8_ = 0;
        auVar451._0_8_ = local_150.n[0];
        auVar178._8_8_ = 0;
        auVar178._0_8_ = uVar646;
        auVar452._8_8_ = 0;
        auVar452._0_8_ = local_150.n[4];
        auVar179._8_8_ = 0;
        auVar179._0_8_ = uVar670;
        auVar453._8_8_ = 0;
        auVar453._0_8_ = local_150.n[3];
        auVar3 = auVar178 * auVar452 + auVar605 + auVar179 * auVar453;
        uVar664 = auVar3._0_8_;
        auVar180._8_8_ = 0;
        auVar180._0_8_ = uVar664 & 0xfffffffffffff;
        auVar2 = auVar175 * auVar449 + auVar604 + auVar176 * auVar450 + auVar177 * auVar451 +
                 auVar180 * ZEXT816(0x1000003d10);
        uVar671 = auVar2._0_8_;
        uVar656 = uVar671 & 0xfffffffffffff;
        auVar606._8_8_ = 0;
        auVar606._0_8_ = (uVar671 >> 0x34 | auVar2._8_8_ << 0xc) + (uVar644 & 0xfffffffffffff);
        auVar181._8_8_ = 0;
        auVar181._0_8_ = uVar664 >> 0x34 | auVar3._8_8_ << 0xc;
        auVar606 = auVar181 * ZEXT816(0x1000003d10) + auVar606;
        uVar664 = auVar606._0_8_;
        uVar644 = uVar664 & 0xfffffffffffff;
        uVar645 = (uVar664 >> 0x34 | auVar606._8_8_ << 0xc) + (uVar645 & 0xffffffffffff);
        if (rzr != (secp256k1_fe *)0x0) {
          rzr->n[4] = local_150.n[4];
          rzr->n[2] = local_150.n[2];
          rzr->n[3] = local_150.n[3];
          rzr->n[0] = local_150.n[0];
          rzr->n[1] = local_150.n[1];
        }
        uVar664 = psVar1->n[0];
        uVar671 = (a->z).n[1];
        uVar650 = (a->z).n[2];
        uVar651 = (a->z).n[3];
        uVar673 = (a->z).n[4];
        auVar182._8_8_ = 0;
        auVar182._0_8_ = local_150.n[0];
        auVar454._8_8_ = 0;
        auVar454._0_8_ = uVar651;
        auVar183._8_8_ = 0;
        auVar183._0_8_ = local_150.n[1];
        auVar455._8_8_ = 0;
        auVar455._0_8_ = uVar650;
        auVar184._8_8_ = 0;
        auVar184._0_8_ = local_150.n[2];
        auVar456._8_8_ = 0;
        auVar456._0_8_ = uVar671;
        auVar185._8_8_ = 0;
        auVar185._0_8_ = local_150.n[3];
        auVar457._8_8_ = 0;
        auVar457._0_8_ = uVar664;
        auVar186._8_8_ = 0;
        auVar186._0_8_ = local_150.n[4];
        auVar458._8_8_ = 0;
        auVar458._0_8_ = uVar673;
        uVar640 = SUB168(auVar186 * auVar458,0);
        auVar187._8_8_ = 0;
        auVar187._0_8_ = uVar640 & 0xfffffffffffff;
        auVar182 = auVar183 * auVar455 + auVar182 * auVar454 + auVar184 * auVar456 +
                   auVar185 * auVar457 + auVar187 * ZEXT816(0x1000003d10);
        uVar648 = auVar182._0_8_;
        auVar607._8_8_ = 0;
        auVar607._0_8_ = uVar648 >> 0x34 | auVar182._8_8_ << 0xc;
        auVar188._8_8_ = 0;
        auVar188._0_8_ = local_150.n[0];
        auVar459._8_8_ = 0;
        auVar459._0_8_ = uVar673;
        auVar189._8_8_ = 0;
        auVar189._0_8_ = local_150.n[1];
        auVar460._8_8_ = 0;
        auVar460._0_8_ = uVar651;
        auVar190._8_8_ = 0;
        auVar190._0_8_ = local_150.n[2];
        auVar461._8_8_ = 0;
        auVar461._0_8_ = uVar650;
        auVar191._8_8_ = 0;
        auVar191._0_8_ = local_150.n[3];
        auVar462._8_8_ = 0;
        auVar462._0_8_ = uVar671;
        auVar192._8_8_ = 0;
        auVar192._0_8_ = local_150.n[4];
        auVar463._8_8_ = 0;
        auVar463._0_8_ = uVar664;
        auVar193._8_8_ = 0;
        auVar193._0_8_ = uVar640 >> 0x34 | SUB168(auVar186 * auVar458,8) << 0xc;
        auVar182 = auVar188 * auVar459 + auVar607 + auVar189 * auVar460 + auVar190 * auVar461 +
                   auVar191 * auVar462 + auVar192 * auVar463 + auVar193 * ZEXT816(0x1000003d10);
        uVar640 = auVar182._0_8_;
        auVar608._8_8_ = 0;
        auVar608._0_8_ = uVar640 >> 0x34 | auVar182._8_8_ << 0xc;
        auVar194._8_8_ = 0;
        auVar194._0_8_ = local_150.n[0];
        auVar464._8_8_ = 0;
        auVar464._0_8_ = uVar664;
        auVar195._8_8_ = 0;
        auVar195._0_8_ = local_150.n[1];
        auVar465._8_8_ = 0;
        auVar465._0_8_ = uVar673;
        auVar196._8_8_ = 0;
        auVar196._0_8_ = local_150.n[2];
        auVar466._8_8_ = 0;
        auVar466._0_8_ = uVar651;
        auVar197._8_8_ = 0;
        auVar197._0_8_ = local_150.n[3];
        auVar467._8_8_ = 0;
        auVar467._0_8_ = uVar650;
        auVar198._8_8_ = 0;
        auVar198._0_8_ = local_150.n[4];
        auVar468._8_8_ = 0;
        auVar468._0_8_ = uVar671;
        auVar182 = auVar195 * auVar465 + auVar608 + auVar196 * auVar466 + auVar197 * auVar467 +
                   auVar198 * auVar468;
        uVar649 = auVar182._0_8_;
        auVar610._8_8_ = 0;
        auVar610._0_8_ = uVar649 >> 0x34 | auVar182._8_8_ << 0xc;
        auVar469._8_8_ = 0;
        auVar469._0_8_ = (uVar649 & 0xfffffffffffff) << 4 | (uVar640 & 0xfffffffffffff) >> 0x30;
        auVar182 = auVar194 * auVar464 + ZEXT816(0x1000003d1) * auVar469;
        uVar649 = auVar182._0_8_;
        (r->z).n[0] = uVar649 & 0xfffffffffffff;
        auVar609._8_8_ = 0;
        auVar609._0_8_ = uVar649 >> 0x34 | auVar182._8_8_ << 0xc;
        auVar199._8_8_ = 0;
        auVar199._0_8_ = local_150.n[0];
        auVar470._8_8_ = 0;
        auVar470._0_8_ = uVar671;
        auVar200._8_8_ = 0;
        auVar200._0_8_ = local_150.n[1];
        auVar471._8_8_ = 0;
        auVar471._0_8_ = uVar664;
        auVar201._8_8_ = 0;
        auVar201._0_8_ = local_150.n[2];
        auVar472._8_8_ = 0;
        auVar472._0_8_ = uVar673;
        auVar202._8_8_ = 0;
        auVar202._0_8_ = local_150.n[3];
        auVar473._8_8_ = 0;
        auVar473._0_8_ = uVar651;
        auVar203._8_8_ = 0;
        auVar203._0_8_ = local_150.n[4];
        auVar474._8_8_ = 0;
        auVar474._0_8_ = uVar650;
        auVar2 = auVar201 * auVar472 + auVar610 + auVar202 * auVar473 + auVar203 * auVar474;
        uVar649 = auVar2._0_8_;
        auVar204._8_8_ = 0;
        auVar204._0_8_ = uVar649 & 0xfffffffffffff;
        auVar182 = auVar199 * auVar470 + auVar609 + auVar200 * auVar471 +
                   auVar204 * ZEXT816(0x1000003d10);
        uVar672 = auVar182._0_8_;
        auVar612._8_8_ = 0;
        auVar612._0_8_ = uVar649 >> 0x34 | auVar2._8_8_ << 0xc;
        (r->z).n[1] = uVar672 & 0xfffffffffffff;
        auVar611._8_8_ = 0;
        auVar611._0_8_ = uVar672 >> 0x34 | auVar182._8_8_ << 0xc;
        auVar205._8_8_ = 0;
        auVar205._0_8_ = local_150.n[0];
        auVar475._8_8_ = 0;
        auVar475._0_8_ = uVar650;
        auVar206._8_8_ = 0;
        auVar206._0_8_ = local_150.n[1];
        auVar476._8_8_ = 0;
        auVar476._0_8_ = uVar671;
        auVar207._8_8_ = 0;
        auVar207._0_8_ = local_150.n[2];
        auVar477._8_8_ = 0;
        auVar477._0_8_ = uVar664;
        auVar208._8_8_ = 0;
        auVar208._0_8_ = local_150.n[3];
        auVar478._8_8_ = 0;
        auVar478._0_8_ = uVar673;
        auVar209._8_8_ = 0;
        auVar209._0_8_ = local_150.n[4];
        auVar479._8_8_ = 0;
        auVar479._0_8_ = uVar651;
        auVar2 = auVar208 * auVar478 + auVar612 + auVar209 * auVar479;
        uVar664 = auVar2._0_8_;
        auVar210._8_8_ = 0;
        auVar210._0_8_ = uVar664 & 0xfffffffffffff;
        auVar182 = auVar205 * auVar475 + auVar611 + auVar206 * auVar476 + auVar207 * auVar477 +
                   auVar210 * ZEXT816(0x1000003d10);
        uVar671 = auVar182._0_8_;
        (r->z).n[2] = uVar671 & 0xfffffffffffff;
        auVar613._8_8_ = 0;
        auVar613._0_8_ = (uVar671 >> 0x34 | auVar182._8_8_ << 0xc) + (uVar648 & 0xfffffffffffff);
        auVar211._8_8_ = 0;
        auVar211._0_8_ = uVar664 >> 0x34 | auVar2._8_8_ << 0xc;
        auVar613 = auVar211 * ZEXT816(0x1000003d10) + auVar613;
        uVar664 = auVar613._0_8_;
        (r->z).n[3] = uVar664 & 0xfffffffffffff;
        (r->z).n[4] = (uVar664 >> 0x34 | auVar613._8_8_ << 0xc) + (uVar640 & 0xffffffffffff);
        auVar212._8_8_ = 0;
        auVar212._0_8_ = uVar661;
        auVar480._8_8_ = 0;
        auVar480._0_8_ = uVar653;
        auVar213._8_8_ = 0;
        auVar213._0_8_ = uVar665;
        auVar481._8_8_ = 0;
        auVar481._0_8_ = uVar660;
        auVar214._8_8_ = 0;
        auVar214._0_8_ = uVar658;
        auVar482._8_8_ = 0;
        auVar482._0_8_ = uVar652;
        auVar215._8_8_ = 0;
        auVar215._0_8_ = uVar646;
        auVar483._8_8_ = 0;
        auVar483._0_8_ = uVar657;
        auVar216._8_8_ = 0;
        auVar216._0_8_ = uVar670;
        auVar484._8_8_ = 0;
        auVar484._0_8_ = uVar642;
        uVar664 = SUB168(auVar216 * auVar484,0);
        auVar217._8_8_ = 0;
        auVar217._0_8_ = uVar664 & 0xfffffffffffff;
        auVar182 = auVar213 * auVar481 + auVar212 * auVar480 + auVar214 * auVar482 +
                   auVar215 * auVar483 + auVar217 * ZEXT816(0x1000003d10);
        uVar650 = auVar182._0_8_;
        auVar614._8_8_ = 0;
        auVar614._0_8_ = uVar650 >> 0x34 | auVar182._8_8_ << 0xc;
        auVar218._8_8_ = 0;
        auVar218._0_8_ = uVar661;
        auVar485._8_8_ = 0;
        auVar485._0_8_ = uVar642;
        auVar219._8_8_ = 0;
        auVar219._0_8_ = uVar665;
        auVar486._8_8_ = 0;
        auVar486._0_8_ = uVar653;
        auVar220._8_8_ = 0;
        auVar220._0_8_ = uVar658;
        auVar487._8_8_ = 0;
        auVar487._0_8_ = uVar660;
        auVar221._8_8_ = 0;
        auVar221._0_8_ = uVar646;
        auVar488._8_8_ = 0;
        auVar488._0_8_ = uVar652;
        auVar222._8_8_ = 0;
        auVar222._0_8_ = uVar670;
        auVar489._8_8_ = 0;
        auVar489._0_8_ = uVar657;
        auVar223._8_8_ = 0;
        auVar223._0_8_ = uVar664 >> 0x34 | SUB168(auVar216 * auVar484,8) << 0xc;
        auVar182 = auVar218 * auVar485 + auVar614 + auVar219 * auVar486 + auVar220 * auVar487 +
                   auVar221 * auVar488 + auVar222 * auVar489 + auVar223 * ZEXT816(0x1000003d10);
        uVar651 = auVar182._0_8_;
        auVar615._8_8_ = 0;
        auVar615._0_8_ = uVar651 >> 0x34 | auVar182._8_8_ << 0xc;
        auVar224._8_8_ = 0;
        auVar224._0_8_ = uVar661;
        auVar490._8_8_ = 0;
        auVar490._0_8_ = uVar657;
        auVar225._8_8_ = 0;
        auVar225._0_8_ = uVar665;
        auVar491._8_8_ = 0;
        auVar491._0_8_ = uVar642;
        auVar226._8_8_ = 0;
        auVar226._0_8_ = uVar658;
        auVar492._8_8_ = 0;
        auVar492._0_8_ = uVar653;
        auVar227._8_8_ = 0;
        auVar227._0_8_ = uVar646;
        auVar493._8_8_ = 0;
        auVar493._0_8_ = uVar660;
        auVar228._8_8_ = 0;
        auVar228._0_8_ = uVar670;
        auVar494._8_8_ = 0;
        auVar494._0_8_ = uVar652;
        auVar182 = auVar225 * auVar491 + auVar615 + auVar226 * auVar492 + auVar227 * auVar493 +
                   auVar228 * auVar494;
        uVar664 = auVar182._0_8_;
        auVar617._8_8_ = 0;
        auVar617._0_8_ = uVar664 >> 0x34 | auVar182._8_8_ << 0xc;
        auVar495._8_8_ = 0;
        auVar495._0_8_ = (uVar664 & 0xfffffffffffff) << 4 | (uVar651 & 0xfffffffffffff) >> 0x30;
        auVar182 = auVar224 * auVar490 + ZEXT816(0x1000003d1) * auVar495;
        uVar671 = auVar182._0_8_;
        uVar664 = uVar671 & 0xfffffffffffff;
        auVar616._8_8_ = 0;
        auVar616._0_8_ = uVar671 >> 0x34 | auVar182._8_8_ << 0xc;
        auVar229._8_8_ = 0;
        auVar229._0_8_ = uVar661;
        auVar496._8_8_ = 0;
        auVar496._0_8_ = uVar652;
        auVar230._8_8_ = 0;
        auVar230._0_8_ = uVar665;
        auVar497._8_8_ = 0;
        auVar497._0_8_ = uVar657;
        auVar231._8_8_ = 0;
        auVar231._0_8_ = uVar658;
        auVar498._8_8_ = 0;
        auVar498._0_8_ = uVar642;
        auVar232._8_8_ = 0;
        auVar232._0_8_ = uVar646;
        auVar499._8_8_ = 0;
        auVar499._0_8_ = uVar653;
        auVar233._8_8_ = 0;
        auVar233._0_8_ = uVar670;
        auVar500._8_8_ = 0;
        auVar500._0_8_ = uVar660;
        auVar2 = auVar231 * auVar498 + auVar617 + auVar232 * auVar499 + auVar233 * auVar500;
        uVar671 = auVar2._0_8_;
        auVar234._8_8_ = 0;
        auVar234._0_8_ = uVar671 & 0xfffffffffffff;
        auVar182 = auVar229 * auVar496 + auVar616 + auVar230 * auVar497 +
                   auVar234 * ZEXT816(0x1000003d10);
        uVar673 = auVar182._0_8_;
        auVar619._8_8_ = 0;
        auVar619._0_8_ = uVar671 >> 0x34 | auVar2._8_8_ << 0xc;
        uVar671 = uVar673 & 0xfffffffffffff;
        auVar618._8_8_ = 0;
        auVar618._0_8_ = uVar673 >> 0x34 | auVar182._8_8_ << 0xc;
        auVar235._8_8_ = 0;
        auVar235._0_8_ = uVar661;
        auVar501._8_8_ = 0;
        auVar501._0_8_ = uVar660;
        auVar236._8_8_ = 0;
        auVar236._0_8_ = uVar665;
        auVar502._8_8_ = 0;
        auVar502._0_8_ = uVar652;
        auVar237._8_8_ = 0;
        auVar237._0_8_ = uVar658;
        auVar503._8_8_ = 0;
        auVar503._0_8_ = uVar657;
        auVar238._8_8_ = 0;
        auVar238._0_8_ = uVar646;
        auVar504._8_8_ = 0;
        auVar504._0_8_ = uVar642;
        auVar239._8_8_ = 0;
        auVar239._0_8_ = uVar670;
        auVar505._8_8_ = 0;
        auVar505._0_8_ = uVar653;
        auVar2 = auVar238 * auVar504 + auVar619 + auVar239 * auVar505;
        uVar661 = auVar2._0_8_;
        auVar240._8_8_ = 0;
        auVar240._0_8_ = uVar661 & 0xfffffffffffff;
        auVar182 = auVar235 * auVar501 + auVar618 + auVar236 * auVar502 + auVar237 * auVar503 +
                   auVar240 * ZEXT816(0x1000003d10);
        uVar665 = auVar182._0_8_;
        uVar658 = uVar665 & 0xfffffffffffff;
        auVar620._8_8_ = 0;
        auVar620._0_8_ = (uVar665 >> 0x34 | auVar182._8_8_ << 0xc) + (uVar650 & 0xfffffffffffff);
        auVar241._8_8_ = 0;
        auVar241._0_8_ = uVar661 >> 0x34 | auVar2._8_8_ << 0xc;
        auVar620 = auVar241 * ZEXT816(0x1000003d10) + auVar620;
        uVar665 = auVar620._0_8_;
        uVar661 = uVar665 & 0xfffffffffffff;
        uVar674 = (uVar665 >> 0x34 | auVar620._8_8_ << 0xc) + (uVar651 & 0xffffffffffff);
        (r->x).n[4] = uVar674;
        (r->x).n[2] = uVar658;
        (r->x).n[3] = uVar661;
        (r->x).n[0] = uVar664;
        (r->x).n[1] = uVar671;
        lVar675 = (uVar666 & 0xfffffffffffff) - ((r->x).n[0] * 2 + uVar647);
        lVar676 = (uVar667 & 0xfffffffffffff) - ((r->x).n[1] * 2 + uVar639);
        (r->x).n[0] = lVar675 + 0x7ffff7ffffe178;
        (r->x).n[1] = lVar676 + 0x7ffffffffffff8;
        lVar677 = (uVar668 & 0xfffffffffffff) - ((r->x).n[2] * 2 + uVar656);
        lVar678 = (uVar669 & 0xfffffffffffff) - ((r->x).n[3] * 2 + uVar644);
        (r->x).n[2] = lVar677 + 0x7ffffffffffff8;
        (r->x).n[3] = lVar678 + 0x7ffffffffffff8;
        lVar641 = ((uVar669 >> 0x34 | auVar592._8_8_ << 0xc) + (uVar659 & 0xffffffffffff)) -
                  (uVar674 * 2 + uVar645);
        (r->x).n[4] = lVar641 + 0x7fffffffffff8;
        (r->y).n[0] = (uVar664 - lVar675) + 0x3ffffbfffff0bc;
        (r->y).n[1] = (uVar671 - lVar676) + 0x3ffffffffffffc;
        (r->y).n[2] = (uVar658 - lVar677) + 0x3ffffffffffffc;
        (r->y).n[3] = (uVar661 - lVar678) + 0x3ffffffffffffc;
        (r->y).n[4] = (uVar674 - lVar641) + 0x3fffffffffffc;
        uVar658 = (r->y).n[0];
        uVar661 = (r->y).n[1];
        uVar665 = (r->y).n[2];
        uVar646 = (r->y).n[3];
        uVar657 = (r->y).n[4];
        auVar242._8_8_ = 0;
        auVar242._0_8_ = local_178.n[0];
        auVar506._8_8_ = 0;
        auVar506._0_8_ = uVar646;
        auVar243._8_8_ = 0;
        auVar243._0_8_ = local_178.n[1];
        auVar507._8_8_ = 0;
        auVar507._0_8_ = uVar665;
        auVar244._8_8_ = 0;
        auVar244._0_8_ = local_178.n[2];
        auVar508._8_8_ = 0;
        auVar508._0_8_ = uVar661;
        auVar245._8_8_ = 0;
        auVar245._0_8_ = local_178.n[3];
        auVar509._8_8_ = 0;
        auVar509._0_8_ = uVar658;
        auVar246._8_8_ = 0;
        auVar246._0_8_ = local_178.n[4];
        auVar510._8_8_ = 0;
        auVar510._0_8_ = uVar657;
        uVar660 = SUB168(auVar246 * auVar510,0);
        auVar247._8_8_ = 0;
        auVar247._0_8_ = uVar660 & 0xfffffffffffff;
        auVar182 = auVar243 * auVar507 + auVar242 * auVar506 + auVar244 * auVar508 +
                   auVar245 * auVar509 + auVar247 * ZEXT816(0x1000003d10);
        uVar642 = auVar182._0_8_;
        auVar621._8_8_ = 0;
        auVar621._0_8_ = uVar642 >> 0x34 | auVar182._8_8_ << 0xc;
        auVar248._8_8_ = 0;
        auVar248._0_8_ = local_178.n[0];
        auVar511._8_8_ = 0;
        auVar511._0_8_ = uVar657;
        auVar249._8_8_ = 0;
        auVar249._0_8_ = local_178.n[1];
        auVar512._8_8_ = 0;
        auVar512._0_8_ = uVar646;
        auVar250._8_8_ = 0;
        auVar250._0_8_ = local_178.n[2];
        auVar513._8_8_ = 0;
        auVar513._0_8_ = uVar665;
        auVar251._8_8_ = 0;
        auVar251._0_8_ = local_178.n[3];
        auVar514._8_8_ = 0;
        auVar514._0_8_ = uVar661;
        auVar252._8_8_ = 0;
        auVar252._0_8_ = local_178.n[4];
        auVar515._8_8_ = 0;
        auVar515._0_8_ = uVar658;
        auVar253._8_8_ = 0;
        auVar253._0_8_ = uVar660 >> 0x34 | SUB168(auVar246 * auVar510,8) << 0xc;
        auVar182 = auVar248 * auVar511 + auVar621 + auVar249 * auVar512 + auVar250 * auVar513 +
                   auVar251 * auVar514 + auVar252 * auVar515 + auVar253 * ZEXT816(0x1000003d10);
        uVar660 = auVar182._0_8_;
        auVar622._8_8_ = 0;
        auVar622._0_8_ = uVar660 >> 0x34 | auVar182._8_8_ << 0xc;
        auVar254._8_8_ = 0;
        auVar254._0_8_ = local_178.n[0];
        auVar516._8_8_ = 0;
        auVar516._0_8_ = uVar658;
        auVar255._8_8_ = 0;
        auVar255._0_8_ = local_178.n[1];
        auVar517._8_8_ = 0;
        auVar517._0_8_ = uVar657;
        auVar256._8_8_ = 0;
        auVar256._0_8_ = local_178.n[2];
        auVar518._8_8_ = 0;
        auVar518._0_8_ = uVar646;
        auVar257._8_8_ = 0;
        auVar257._0_8_ = local_178.n[3];
        auVar519._8_8_ = 0;
        auVar519._0_8_ = uVar665;
        auVar258._8_8_ = 0;
        auVar258._0_8_ = local_178.n[4];
        auVar520._8_8_ = 0;
        auVar520._0_8_ = uVar661;
        auVar182 = auVar255 * auVar517 + auVar622 + auVar256 * auVar518 + auVar257 * auVar519 +
                   auVar258 * auVar520;
        uVar652 = auVar182._0_8_;
        auVar624._8_8_ = 0;
        auVar624._0_8_ = uVar652 >> 0x34 | auVar182._8_8_ << 0xc;
        auVar521._8_8_ = 0;
        auVar521._0_8_ = (uVar652 & 0xfffffffffffff) << 4 | (uVar660 & 0xfffffffffffff) >> 0x30;
        auVar182 = auVar254 * auVar516 + ZEXT816(0x1000003d1) * auVar521;
        uVar652 = auVar182._0_8_;
        (r->y).n[0] = uVar652 & 0xfffffffffffff;
        auVar623._8_8_ = 0;
        auVar623._0_8_ = uVar652 >> 0x34 | auVar182._8_8_ << 0xc;
        auVar259._8_8_ = 0;
        auVar259._0_8_ = local_178.n[0];
        auVar522._8_8_ = 0;
        auVar522._0_8_ = uVar661;
        auVar260._8_8_ = 0;
        auVar260._0_8_ = local_178.n[1];
        auVar523._8_8_ = 0;
        auVar523._0_8_ = uVar658;
        auVar261._8_8_ = 0;
        auVar261._0_8_ = local_178.n[2];
        auVar524._8_8_ = 0;
        auVar524._0_8_ = uVar657;
        auVar262._8_8_ = 0;
        auVar262._0_8_ = local_178.n[3];
        auVar525._8_8_ = 0;
        auVar525._0_8_ = uVar646;
        auVar263._8_8_ = 0;
        auVar263._0_8_ = local_178.n[4];
        auVar526._8_8_ = 0;
        auVar526._0_8_ = uVar665;
        auVar2 = auVar261 * auVar524 + auVar624 + auVar262 * auVar525 + auVar263 * auVar526;
        uVar652 = auVar2._0_8_;
        auVar264._8_8_ = 0;
        auVar264._0_8_ = uVar652 & 0xfffffffffffff;
        auVar182 = auVar259 * auVar522 + auVar623 + auVar260 * auVar523 +
                   auVar264 * ZEXT816(0x1000003d10);
        uVar653 = auVar182._0_8_;
        auVar626._8_8_ = 0;
        auVar626._0_8_ = uVar652 >> 0x34 | auVar2._8_8_ << 0xc;
        (r->y).n[1] = uVar653 & 0xfffffffffffff;
        auVar625._8_8_ = 0;
        auVar625._0_8_ = uVar653 >> 0x34 | auVar182._8_8_ << 0xc;
        auVar265._8_8_ = 0;
        auVar265._0_8_ = local_178.n[0];
        auVar527._8_8_ = 0;
        auVar527._0_8_ = uVar665;
        auVar266._8_8_ = 0;
        auVar266._0_8_ = local_178.n[1];
        auVar528._8_8_ = 0;
        auVar528._0_8_ = uVar661;
        auVar267._8_8_ = 0;
        auVar267._0_8_ = local_178.n[2];
        auVar529._8_8_ = 0;
        auVar529._0_8_ = uVar658;
        auVar268._8_8_ = 0;
        auVar268._0_8_ = local_178.n[3];
        auVar530._8_8_ = 0;
        auVar530._0_8_ = uVar657;
        auVar269._8_8_ = 0;
        auVar269._0_8_ = local_178.n[4];
        auVar531._8_8_ = 0;
        auVar531._0_8_ = uVar646;
        auVar2 = auVar268 * auVar530 + auVar626 + auVar269 * auVar531;
        uVar658 = auVar2._0_8_;
        auVar270._8_8_ = 0;
        auVar270._0_8_ = uVar658 & 0xfffffffffffff;
        auVar182 = auVar265 * auVar527 + auVar625 + auVar266 * auVar528 + auVar267 * auVar529 +
                   auVar270 * ZEXT816(0x1000003d10);
        uVar661 = auVar182._0_8_;
        (r->y).n[2] = uVar661 & 0xfffffffffffff;
        auVar627._8_8_ = 0;
        auVar627._0_8_ = (uVar661 >> 0x34 | auVar182._8_8_ << 0xc) + (uVar642 & 0xfffffffffffff);
        auVar271._8_8_ = 0;
        auVar271._0_8_ = uVar658 >> 0x34 | auVar2._8_8_ << 0xc;
        auVar627 = auVar271 * ZEXT816(0x1000003d10) + auVar627;
        uVar658 = auVar627._0_8_;
        (r->y).n[3] = uVar658 & 0xfffffffffffff;
        (r->y).n[4] = (uVar658 >> 0x34 | auVar627._8_8_ << 0xc) + (uVar660 & 0xffffffffffff);
        auVar272._8_8_ = 0;
        auVar272._0_8_ = uVar643;
        auVar532._8_8_ = 0;
        auVar532._0_8_ = uVar644;
        auVar273._8_8_ = 0;
        auVar273._0_8_ = uVar654;
        auVar533._8_8_ = 0;
        auVar533._0_8_ = uVar656;
        auVar274._8_8_ = 0;
        auVar274._0_8_ = uVar662;
        auVar534._8_8_ = 0;
        auVar534._0_8_ = uVar639;
        auVar275._8_8_ = 0;
        auVar275._0_8_ = uVar655;
        auVar535._8_8_ = 0;
        auVar535._0_8_ = uVar647;
        auVar276._8_8_ = 0;
        auVar276._0_8_ = uVar663;
        auVar536._8_8_ = 0;
        auVar536._0_8_ = uVar645;
        uVar658 = SUB168(auVar276 * auVar536,0);
        auVar277._8_8_ = 0;
        auVar277._0_8_ = uVar658 & 0xfffffffffffff;
        auVar182 = auVar273 * auVar533 + auVar272 * auVar532 + auVar274 * auVar534 +
                   auVar275 * auVar535 + auVar277 * ZEXT816(0x1000003d10);
        uVar661 = auVar182._0_8_;
        auVar628._8_8_ = 0;
        auVar628._0_8_ = uVar661 >> 0x34 | auVar182._8_8_ << 0xc;
        auVar278._8_8_ = 0;
        auVar278._0_8_ = uVar643;
        auVar537._8_8_ = 0;
        auVar537._0_8_ = uVar645;
        auVar279._8_8_ = 0;
        auVar279._0_8_ = uVar654;
        auVar538._8_8_ = 0;
        auVar538._0_8_ = uVar644;
        auVar280._8_8_ = 0;
        auVar280._0_8_ = uVar662;
        auVar539._8_8_ = 0;
        auVar539._0_8_ = uVar656;
        auVar281._8_8_ = 0;
        auVar281._0_8_ = uVar655;
        auVar540._8_8_ = 0;
        auVar540._0_8_ = uVar639;
        auVar282._8_8_ = 0;
        auVar282._0_8_ = uVar663;
        auVar541._8_8_ = 0;
        auVar541._0_8_ = uVar647;
        auVar283._8_8_ = 0;
        auVar283._0_8_ = uVar658 >> 0x34 | SUB168(auVar276 * auVar536,8) << 0xc;
        auVar182 = auVar278 * auVar537 + auVar628 + auVar279 * auVar538 + auVar280 * auVar539 +
                   auVar281 * auVar540 + auVar282 * auVar541 + auVar283 * ZEXT816(0x1000003d10);
        uVar658 = auVar182._0_8_;
        auVar629._8_8_ = 0;
        auVar629._0_8_ = uVar658 >> 0x34 | auVar182._8_8_ << 0xc;
        auVar284._8_8_ = 0;
        auVar284._0_8_ = uVar643;
        auVar542._8_8_ = 0;
        auVar542._0_8_ = uVar647;
        auVar285._8_8_ = 0;
        auVar285._0_8_ = uVar654;
        auVar543._8_8_ = 0;
        auVar543._0_8_ = uVar645;
        auVar286._8_8_ = 0;
        auVar286._0_8_ = uVar662;
        auVar544._8_8_ = 0;
        auVar544._0_8_ = uVar644;
        auVar287._8_8_ = 0;
        auVar287._0_8_ = uVar655;
        auVar545._8_8_ = 0;
        auVar545._0_8_ = uVar656;
        auVar288._8_8_ = 0;
        auVar288._0_8_ = uVar663;
        auVar546._8_8_ = 0;
        auVar546._0_8_ = uVar639;
        auVar182 = auVar285 * auVar543 + auVar629 + auVar286 * auVar544 + auVar287 * auVar545 +
                   auVar288 * auVar546;
        uVar665 = auVar182._0_8_;
        auVar631._8_8_ = 0;
        auVar631._0_8_ = uVar665 >> 0x34 | auVar182._8_8_ << 0xc;
        auVar547._8_8_ = 0;
        auVar547._0_8_ = (uVar665 & 0xfffffffffffff) << 4 | (uVar658 & 0xfffffffffffff) >> 0x30;
        auVar182 = auVar284 * auVar542 + ZEXT816(0x1000003d1) * auVar547;
        uVar646 = auVar182._0_8_;
        auVar630._8_8_ = 0;
        auVar630._0_8_ = uVar646 >> 0x34 | auVar182._8_8_ << 0xc;
        auVar289._8_8_ = 0;
        auVar289._0_8_ = uVar643;
        auVar548._8_8_ = 0;
        auVar548._0_8_ = uVar639;
        auVar290._8_8_ = 0;
        auVar290._0_8_ = uVar654;
        auVar549._8_8_ = 0;
        auVar549._0_8_ = uVar647;
        auVar291._8_8_ = 0;
        auVar291._0_8_ = uVar662;
        auVar550._8_8_ = 0;
        auVar550._0_8_ = uVar645;
        auVar292._8_8_ = 0;
        auVar292._0_8_ = uVar655;
        auVar551._8_8_ = 0;
        auVar551._0_8_ = uVar644;
        auVar293._8_8_ = 0;
        auVar293._0_8_ = uVar663;
        auVar552._8_8_ = 0;
        auVar552._0_8_ = uVar656;
        auVar2 = auVar291 * auVar550 + auVar631 + auVar292 * auVar551 + auVar293 * auVar552;
        uVar665 = auVar2._0_8_;
        auVar294._8_8_ = 0;
        auVar294._0_8_ = uVar665 & 0xfffffffffffff;
        auVar182 = auVar289 * auVar548 + auVar630 + auVar290 * auVar549 +
                   auVar294 * ZEXT816(0x1000003d10);
        uVar657 = auVar182._0_8_;
        auVar633._8_8_ = 0;
        auVar633._0_8_ = uVar665 >> 0x34 | auVar2._8_8_ << 0xc;
        auVar632._8_8_ = 0;
        auVar632._0_8_ = uVar657 >> 0x34 | auVar182._8_8_ << 0xc;
        auVar295._8_8_ = 0;
        auVar295._0_8_ = uVar643;
        auVar553._8_8_ = 0;
        auVar553._0_8_ = uVar656;
        auVar296._8_8_ = 0;
        auVar296._0_8_ = uVar654;
        auVar554._8_8_ = 0;
        auVar554._0_8_ = uVar639;
        auVar297._8_8_ = 0;
        auVar297._0_8_ = uVar662;
        auVar555._8_8_ = 0;
        auVar555._0_8_ = uVar647;
        auVar298._8_8_ = 0;
        auVar298._0_8_ = uVar655;
        auVar556._8_8_ = 0;
        auVar556._0_8_ = uVar645;
        auVar299._8_8_ = 0;
        auVar299._0_8_ = uVar663;
        auVar557._8_8_ = 0;
        auVar557._0_8_ = uVar644;
        auVar2 = auVar298 * auVar556 + auVar633 + auVar299 * auVar557;
        uVar665 = auVar2._0_8_;
        auVar300._8_8_ = 0;
        auVar300._0_8_ = uVar665 & 0xfffffffffffff;
        auVar182 = auVar295 * auVar553 + auVar632 + auVar296 * auVar554 + auVar297 * auVar555 +
                   auVar300 * ZEXT816(0x1000003d10);
        uVar647 = auVar182._0_8_;
        auVar634._8_8_ = 0;
        auVar634._0_8_ = (uVar647 >> 0x34 | auVar182._8_8_ << 0xc) + (uVar661 & 0xfffffffffffff);
        auVar301._8_8_ = 0;
        auVar301._0_8_ = uVar665 >> 0x34 | auVar2._8_8_ << 0xc;
        auVar634 = auVar301 * ZEXT816(0x1000003d10) + auVar634;
        uVar661 = auVar634._0_8_;
        uVar635 = (r->y).n[1];
        uVar636 = (r->y).n[2];
        uVar637 = (r->y).n[3];
        uVar674 = (r->y).n[4];
        (r->y).n[0] = ((r->y).n[0] - (uVar646 & 0xfffffffffffff)) + 0x3ffffbfffff0bc;
        (r->y).n[1] = (uVar635 - (uVar657 & 0xfffffffffffff)) + 0x3ffffffffffffc;
        (r->y).n[2] = (uVar636 - (uVar647 & 0xfffffffffffff)) + 0x3ffffffffffffc;
        (r->y).n[3] = (uVar637 - (uVar661 & 0xfffffffffffff)) + 0x3ffffffffffffc;
        (r->y).n[4] = (uVar674 -
                      ((uVar661 >> 0x34 | auVar634._8_8_ << 0xc) + (uVar658 & 0xffffffffffff))) +
                      0x3fffffffffffc;
      }
      else {
        iVar638 = secp256k1_fe_normalizes_to_zero_var(&local_178);
        if (iVar638 == 0) {
          if (rzr != (secp256k1_fe *)0x0) {
            rzr->n[2] = 0;
            rzr->n[3] = 0;
            rzr->n[0] = 0;
            rzr->n[1] = 0;
            rzr->n[4] = 0;
          }
          r->infinity = 1;
          (r->x).n[0] = 0;
          (r->x).n[1] = 0;
          (r->x).n[2] = 0;
          (r->x).n[3] = 0;
          *(undefined1 (*) [16])((r->x).n + 4) = (undefined1  [16])0x0;
          (r->y).n[1] = 0;
          (r->y).n[2] = 0;
          (r->y).n[3] = 0;
          (r->y).n[4] = 0;
          (r->z).n[0] = 0;
          (r->z).n[1] = 0;
          (r->z).n[2] = 0;
          (r->z).n[3] = 0;
          (r->z).n[4] = 0;
        }
        else {
          secp256k1_gej_double_var(r,a,rzr);
        }
      }
    }
    else {
      if (rzr != (secp256k1_fe *)0x0) {
        rzr->n[0] = 1;
        rzr->n[1] = 0;
        rzr->n[2] = 0;
        rzr->n[3] = 0;
        rzr->n[4] = 0;
      }
      for (lVar641 = 0x10; lVar641 != 0; lVar641 = lVar641 + -1) {
        (r->x).n[0] = (a->x).n[0];
        a = (secp256k1_gej *)((a->x).n + 1);
        r = (secp256k1_gej *)((r->x).n + 1);
      }
    }
  }
  else {
    r->infinity = b->infinity;
    uVar674 = (b->x).n[1];
    uVar635 = (b->x).n[2];
    uVar636 = (b->x).n[3];
    (r->x).n[0] = (b->x).n[0];
    (r->x).n[1] = uVar674;
    (r->x).n[2] = uVar635;
    (r->x).n[3] = uVar636;
    (r->x).n[4] = (b->x).n[4];
    uVar674 = (b->y).n[1];
    uVar635 = (b->y).n[2];
    uVar636 = (b->y).n[3];
    (r->y).n[0] = (b->y).n[0];
    (r->y).n[1] = uVar674;
    (r->y).n[2] = uVar635;
    (r->y).n[3] = uVar636;
    (r->y).n[4] = (b->y).n[4];
    (r->z).n[0] = 1;
    (r->z).n[1] = 0;
    (r->z).n[2] = 0;
    (r->z).n[3] = 0;
    (r->z).n[4] = 0;
  }
  return;
}

Assistant:

static void secp256k1_gej_add_ge_var(secp256k1_gej *r, const secp256k1_gej *a, const secp256k1_ge *b, secp256k1_fe *rzr) {
    /* 8 mul, 3 sqr, 4 normalize, 12 mul_int/add/negate */
    secp256k1_fe z12, u1, u2, s1, s2, h, i, i2, h2, h3, t;
    if (a->infinity) {
        VERIFY_CHECK(rzr == NULL);
        secp256k1_gej_set_ge(r, b);
        return;
    }
    if (b->infinity) {
        if (rzr != NULL) {
            secp256k1_fe_set_int(rzr, 1);
        }
        *r = *a;
        return;
    }
    r->infinity = 0;

    secp256k1_fe_sqr(&z12, &a->z);
    u1 = a->x; secp256k1_fe_normalize_weak(&u1);
    secp256k1_fe_mul(&u2, &b->x, &z12);
    s1 = a->y; secp256k1_fe_normalize_weak(&s1);
    secp256k1_fe_mul(&s2, &b->y, &z12); secp256k1_fe_mul(&s2, &s2, &a->z);
    secp256k1_fe_negate(&h, &u1, 1); secp256k1_fe_add(&h, &u2);
    secp256k1_fe_negate(&i, &s1, 1); secp256k1_fe_add(&i, &s2);
    if (secp256k1_fe_normalizes_to_zero_var(&h)) {
        if (secp256k1_fe_normalizes_to_zero_var(&i)) {
            secp256k1_gej_double_var(r, a, rzr);
        } else {
            if (rzr != NULL) {
                secp256k1_fe_set_int(rzr, 0);
            }
            secp256k1_gej_set_infinity(r);
        }
        return;
    }
    secp256k1_fe_sqr(&i2, &i);
    secp256k1_fe_sqr(&h2, &h);
    secp256k1_fe_mul(&h3, &h, &h2);
    if (rzr != NULL) {
        *rzr = h;
    }
    secp256k1_fe_mul(&r->z, &a->z, &h);
    secp256k1_fe_mul(&t, &u1, &h2);
    r->x = t; secp256k1_fe_mul_int(&r->x, 2); secp256k1_fe_add(&r->x, &h3); secp256k1_fe_negate(&r->x, &r->x, 3); secp256k1_fe_add(&r->x, &i2);
    secp256k1_fe_negate(&r->y, &r->x, 5); secp256k1_fe_add(&r->y, &t); secp256k1_fe_mul(&r->y, &r->y, &i);
    secp256k1_fe_mul(&h3, &h3, &s1); secp256k1_fe_negate(&h3, &h3, 1);
    secp256k1_fe_add(&r->y, &h3);
}